

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86.cpp
# Opt level: O0

int __thiscall
ncnn::LayerNorm_x86::forward_inplace(LayerNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined8 uVar33;
  undefined8 uVar34;
  long *in_RSI;
  long *in_RDI;
  float fVar35;
  float fVar36;
  double dVar37;
  float fVar39;
  float fVar40;
  undefined1 auVar38 [16];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM3 [16];
  float *ptr_3;
  int q_1;
  float *ptr_2;
  int i_11;
  int q;
  float *ptr_1;
  int i_5;
  float *ptr;
  int elemcount;
  float *beta;
  float *gamma;
  int channels;
  int h;
  int w;
  int elempack;
  int dims;
  __m128 _mean_11;
  __m128 _sqrt_var_3;
  __m128 _var_7;
  __m128 _b_9;
  __m128 _eps_3;
  __m128 _a_9;
  float *b_3;
  float *a_3;
  float var_3 [16];
  float mean_3 [16];
  __m128 _mean_8;
  __m128 _sqrt_var_2;
  __m128 _var_5;
  __m128 _b_6;
  __m128 _eps_2;
  __m128 _a_6;
  float *b_2;
  float *a_2;
  float var_2 [16];
  float mean_2 [16];
  __m128 _mean_5;
  __m128 _sqrt_var_1;
  __m128 _var_3;
  __m128 _b_3;
  __m128 _eps_1;
  __m128 _a_3;
  float *b_1;
  float *a_1;
  float var_1 [16];
  float mean_1 [16];
  __m128 _mean_2;
  __m128 _sqrt_var;
  __m128 _var_1;
  __m128 _b;
  __m128 _eps;
  __m128 _a;
  float *b;
  float *a;
  float var [16];
  float mean [16];
  Mat *m_1;
  Mat *m;
  __m128 _mean;
  float sum;
  __m128 _cur;
  __m128 _sum_128;
  int i;
  __m128 _mean_3;
  float sum_1;
  __m128 _cur_5;
  __m128 _sum_128_1;
  int i_6;
  __m128 _mean_6;
  float sum_2;
  __m128 _cur_10;
  __m128 _sum_128_2;
  int i_12;
  __m128 _mean_9;
  float sum_3;
  __m128 _cur_15;
  __m128 _sum_128_3;
  int i_17;
  __m128 _var;
  float tmp;
  float sq_sum;
  __m128 _cur_1;
  __m128 _sq_sum_128;
  int i_1;
  __m128 _mean_128;
  float _mean_1;
  __m128 _var_2;
  float tmp_1;
  float sq_sum_1;
  __m128 _cur_6;
  __m128 _sq_sum_128_1;
  int i_7;
  __m128 _mean_128_1;
  float _mean_4;
  __m128 _var_4;
  float tmp_2;
  float sq_sum_2;
  __m128 _cur_11;
  __m128 _sq_sum_128_2;
  int i_13;
  __m128 _mean_128_2;
  float _mean_7;
  __m128 _var_6;
  float tmp_3;
  float sq_sum_3;
  __m128 _cur_16;
  __m128 _sq_sum_128_3;
  int i_18;
  __m128 _mean_128_3;
  float _mean_10;
  __m128 _beta_1;
  __m128 _gamma_1;
  __m128 _cur_3;
  __m128 _b_128_1;
  __m128 _a_128_1;
  float _b_1;
  float _a_1;
  int i_3;
  __m128 _beta;
  __m128 _gamma;
  __m128 _cur_2;
  __m128 _b_128;
  __m128 _a_128;
  int i_2;
  __m128 _beta_3;
  __m128 _gamma_3;
  __m128 _cur_8;
  __m128 _b_128_4;
  __m128 _a_128_4;
  float _b_4;
  float _a_4;
  int i_9;
  __m128 _beta_2;
  __m128 _gamma_2;
  __m128 _cur_7;
  __m128 _b_128_3;
  __m128 _a_128_3;
  int i_8;
  __m128 _beta_5;
  __m128 _gamma_5;
  __m128 _cur_13;
  __m128 _b_128_7;
  __m128 _a_128_7;
  float _b_7;
  float _a_7;
  int i_15;
  __m128 _beta_4;
  __m128 _gamma_4;
  __m128 _cur_12;
  __m128 _b_128_6;
  __m128 _a_128_6;
  int i_14;
  __m128 _beta_7;
  __m128 _gamma_7;
  __m128 _cur_18;
  __m128 _b_128_10;
  __m128 _a_128_10;
  float _b_10;
  float _a_10;
  int i_20;
  __m128 _beta_6;
  __m128 _gamma_6;
  __m128 _cur_17;
  __m128 _b_128_9;
  __m128 _a_128_9;
  int i_19;
  __m128 _cur_4;
  int i_4;
  __m128 _b_128_2;
  __m128 _a_128_2;
  float _b_2;
  float _a_2;
  __m128 _cur_9;
  int i_10;
  __m128 _b_128_5;
  __m128 _a_128_5;
  float _b_5;
  float _a_5;
  __m128 _cur_14;
  int i_16;
  __m128 _b_128_8;
  __m128 _a_128_8;
  float _b_8;
  float _a_8;
  __m128 _cur_19;
  int i_21;
  __m128 _b_128_11;
  __m128 _a_128_11;
  float _b_11;
  float _a_11;
  __m128 x32_7;
  __m128 x64_7;
  __m128 x32_5;
  __m128 x64_5;
  __m128 x32_3;
  __m128 x64_3;
  __m128 x32_1;
  __m128 x64_1;
  __m128 x32_6;
  __m128 x64_6;
  __m128 x32_4;
  __m128 x64_4;
  __m128 x32_2;
  __m128 x64_2;
  __m128 x32;
  __m128 x64;
  undefined8 local_31e8;
  undefined8 uStack_31e0;
  undefined8 local_31d8;
  undefined8 uStack_31d0;
  undefined8 local_31c8;
  undefined8 uStack_31c0;
  undefined8 local_3178;
  undefined8 uStack_3170;
  undefined8 local_3168;
  undefined8 uStack_3160;
  undefined8 local_3158;
  undefined8 uStack_3150;
  undefined8 local_3108;
  undefined8 uStack_3100;
  undefined8 local_30f8;
  undefined8 uStack_30f0;
  undefined8 local_30e8;
  undefined8 uStack_30e0;
  undefined8 local_30c8;
  undefined8 uStack_30c0;
  undefined8 local_30b8;
  undefined8 uStack_30b0;
  undefined8 local_3080;
  undefined8 local_3078;
  undefined8 local_3070;
  undefined4 local_3068;
  long local_3060;
  undefined4 local_3058;
  undefined4 local_3054;
  undefined4 local_3050;
  undefined4 local_304c;
  undefined4 local_3048;
  undefined8 local_3040;
  float *local_3038;
  int local_3030;
  undefined8 local_3020;
  undefined8 local_3018;
  undefined8 local_3010;
  undefined4 local_3008;
  long local_3000;
  undefined4 local_2ff8;
  undefined4 local_2ff4;
  undefined4 local_2ff0;
  undefined4 local_2fec;
  undefined4 local_2fe8;
  undefined8 local_2fe0;
  undefined1 (*local_2fd8) [16];
  int local_2fd0;
  int local_2fcc;
  undefined1 (*local_2fc8) [16];
  int local_2fbc;
  undefined1 (*local_2fb8) [16];
  int local_2fac;
  float *local_2fa8;
  float *local_2fa0;
  int local_2f94;
  int local_2f90;
  int local_2f8c;
  int local_2f88;
  int local_2f84;
  long *local_2f78;
  undefined8 *local_2f68;
  undefined8 *local_2f60;
  undefined8 *local_2f58;
  undefined8 local_2f48;
  undefined8 uStack_2f40;
  uint local_2f38;
  uint uStack_2f34;
  uint uStack_2f30;
  uint uStack_2f2c;
  undefined8 local_2f28;
  undefined8 uStack_2f20;
  undefined8 local_2f18;
  undefined8 uStack_2f10;
  undefined8 local_2f08;
  undefined8 uStack_2f00;
  undefined1 local_2ef8 [16];
  float *local_2ee8;
  float *local_2ee0;
  undefined8 local_2ed8;
  undefined8 uStack_2ed0;
  undefined8 local_2ec8;
  undefined8 uStack_2ec0;
  undefined8 local_2eb8;
  undefined8 uStack_2eb0;
  undefined8 local_2ea8;
  undefined8 uStack_2ea0;
  undefined8 local_2e98;
  undefined8 uStack_2e90;
  undefined8 local_2e88;
  undefined8 uStack_2e80;
  undefined8 local_2e78;
  undefined8 uStack_2e70;
  undefined8 local_2e68;
  undefined8 uStack_2e60;
  float local_2e58;
  int local_2e54;
  float *local_2e50;
  float *local_2e48;
  int local_2e3c;
  int local_2e38;
  int local_2e34;
  float *local_2e30;
  undefined8 local_2e28;
  undefined8 uStack_2e20;
  uint local_2e18;
  uint uStack_2e14;
  uint uStack_2e10;
  uint uStack_2e0c;
  undefined8 local_2e08;
  undefined8 uStack_2e00;
  float local_2df8;
  float fStack_2df4;
  float fStack_2df0;
  float fStack_2dec;
  undefined8 local_2de8;
  undefined8 uStack_2de0;
  undefined1 local_2dd8 [16];
  undefined1 (*local_2dc8) [16];
  float *local_2dc0;
  undefined1 local_2db8 [16];
  undefined8 local_2da8;
  undefined8 uStack_2da0;
  undefined8 local_2d98;
  undefined8 uStack_2d90;
  undefined8 local_2d88;
  undefined8 uStack_2d80;
  float local_2d78 [17];
  int local_2d34;
  float *local_2d30;
  float *local_2d28;
  int local_2d1c;
  int local_2d18;
  int local_2d14;
  undefined1 (*local_2d10) [16];
  undefined8 local_2d08;
  undefined8 uStack_2d00;
  uint local_2cf8;
  uint uStack_2cf4;
  uint uStack_2cf0;
  uint uStack_2cec;
  undefined8 local_2ce8;
  undefined8 uStack_2ce0;
  float local_2cd8;
  float fStack_2cd4;
  float fStack_2cd0;
  float fStack_2ccc;
  undefined8 local_2cc8;
  undefined8 uStack_2cc0;
  undefined1 local_2cb8 [16];
  undefined1 (*local_2ca8) [16];
  float *local_2ca0;
  undefined1 local_2c98 [16];
  undefined8 local_2c88;
  undefined8 uStack_2c80;
  undefined8 local_2c78;
  undefined8 uStack_2c70;
  undefined8 local_2c68;
  undefined8 uStack_2c60;
  float local_2c58 [17];
  int local_2c14;
  float *local_2c10;
  float *local_2c08;
  int local_2bfc;
  int local_2bf8;
  int local_2bf4;
  undefined1 (*local_2bf0) [16];
  undefined1 (*local_2b88) [16];
  float *local_2b80;
  undefined1 local_2b78 [16];
  undefined8 local_2b68;
  undefined8 uStack_2b60;
  undefined8 local_2b58;
  undefined8 uStack_2b50;
  undefined8 local_2b48;
  undefined8 uStack_2b40;
  float local_2b38 [17];
  int local_2af4;
  float *local_2af0;
  float *local_2ae8;
  int local_2adc;
  int local_2ad8;
  int local_2ad4;
  undefined1 (*local_2ad0) [16];
  int local_2ac4;
  undefined8 *local_2ac0;
  int local_2ab4;
  long *local_2ab0;
  undefined1 local_2aa5;
  int local_2aa4;
  undefined8 *local_2a98;
  undefined1 local_2a8d;
  int local_2a8c;
  undefined8 *local_2a80;
  undefined8 *local_2a68;
  undefined8 *local_2a58;
  float local_2a2c;
  undefined8 local_2a28;
  undefined8 uStack_2a20;
  undefined8 local_2a18;
  undefined8 uStack_2a10;
  int local_2a08;
  int local_2a04;
  int local_2a00;
  undefined4 local_29fc;
  float *local_29f8;
  undefined1 (*local_29f0) [16];
  undefined1 local_29e8 [16];
  float local_29cc;
  undefined8 local_29c8;
  undefined8 uStack_29c0;
  undefined8 local_29b8;
  undefined8 uStack_29b0;
  int local_29a8;
  int local_29a4;
  int local_29a0;
  int local_299c;
  float *local_2998;
  undefined1 (*local_2990) [16];
  undefined1 local_2988 [16];
  float local_296c;
  undefined8 local_2968;
  undefined8 uStack_2960;
  undefined8 local_2958;
  undefined8 uStack_2950;
  int local_2948;
  int local_2944;
  int local_2940;
  int local_293c;
  float *local_2938;
  undefined1 (*local_2930) [16];
  undefined1 local_2928 [16];
  float local_290c;
  undefined8 local_2908;
  undefined8 uStack_2900;
  undefined8 local_28f8;
  undefined8 uStack_28f0;
  int local_28e8;
  int local_28e4;
  int local_28e0;
  int local_28dc;
  undefined8 *local_28d8;
  float *local_28d0;
  float local_28b0;
  float local_28ac;
  undefined8 local_28a8;
  undefined8 uStack_28a0;
  undefined8 local_2898;
  undefined8 uStack_2890;
  int local_287c;
  undefined8 local_2878;
  undefined8 uStack_2870;
  float local_2860;
  int local_285c;
  int local_2858;
  undefined4 local_2854;
  float *local_2850;
  undefined1 *local_2848;
  undefined1 (*local_2840) [16];
  undefined1 local_2838 [16];
  float local_2820;
  float local_281c;
  undefined8 local_2818;
  undefined8 uStack_2810;
  undefined8 local_2808;
  undefined8 uStack_2800;
  int local_27ec;
  undefined8 local_27e8;
  undefined8 uStack_27e0;
  float local_27d0;
  int local_27cc;
  int local_27c8;
  int local_27c4;
  float *local_27c0;
  undefined1 *local_27b8;
  undefined1 (*local_27b0) [16];
  undefined1 local_27a8 [16];
  float local_2790;
  float local_278c;
  undefined8 local_2788;
  undefined8 uStack_2780;
  undefined8 local_2778;
  undefined8 uStack_2770;
  int local_275c;
  undefined8 local_2758;
  undefined8 uStack_2750;
  float local_2740;
  int local_273c;
  int local_2738;
  int local_2734;
  float *local_2730;
  undefined1 *local_2728;
  undefined1 (*local_2720) [16];
  undefined1 local_2718 [16];
  float local_2700;
  float local_26fc;
  undefined8 local_26f8;
  undefined8 uStack_26f0;
  undefined8 local_26e8;
  undefined8 uStack_26e0;
  int local_26cc;
  undefined8 local_26c8;
  undefined8 uStack_26c0;
  float local_26b0;
  int local_26ac;
  int local_26a8;
  int local_26a4;
  undefined8 *local_26a0;
  undefined8 *local_2698;
  float *local_2690;
  float local_2688;
  float fStack_2684;
  float fStack_2680;
  float fStack_267c;
  float local_2678;
  float local_2668;
  float fStack_2664;
  float fStack_2660;
  float fStack_265c;
  float local_2658;
  float local_2648;
  float fStack_2644;
  float fStack_2640;
  float fStack_263c;
  float local_2638;
  float local_2628;
  float fStack_2624;
  float fStack_2620;
  float fStack_261c;
  float local_2618;
  float local_2608;
  float fStack_2604;
  float fStack_2600;
  float fStack_25fc;
  float local_25f8;
  float local_25e8;
  float fStack_25e4;
  float fStack_25e0;
  float fStack_25dc;
  float local_25d8;
  float local_25a8;
  float fStack_25a4;
  float fStack_25a0;
  float fStack_259c;
  float local_2598;
  float local_2588;
  float fStack_2584;
  float fStack_2580;
  float fStack_257c;
  float local_2578;
  float local_2568;
  float fStack_2564;
  float fStack_2560;
  float fStack_255c;
  float local_2558;
  float local_2548;
  float fStack_2544;
  float fStack_2540;
  float fStack_253c;
  float local_2538;
  float local_24c8;
  float fStack_24c4;
  float fStack_24c0;
  float fStack_24bc;
  float local_24ac;
  undefined4 local_24a8;
  undefined4 uStack_24a4;
  undefined4 uStack_24a0;
  undefined4 uStack_249c;
  undefined4 local_248c;
  float local_2488;
  float fStack_2484;
  float fStack_2480;
  float fStack_247c;
  float local_246c;
  undefined4 local_2468;
  undefined4 uStack_2464;
  undefined4 uStack_2460;
  undefined4 uStack_245c;
  undefined4 local_244c;
  float local_2448;
  float fStack_2444;
  float fStack_2440;
  float fStack_243c;
  float local_242c;
  undefined4 local_2428;
  undefined4 uStack_2424;
  undefined4 uStack_2420;
  undefined4 uStack_241c;
  undefined4 local_240c;
  undefined8 local_2408;
  undefined8 uStack_2400;
  undefined8 local_23f8;
  undefined8 uStack_23f0;
  undefined8 local_23e8;
  undefined8 uStack_23e0;
  undefined8 local_23d8;
  undefined8 uStack_23d0;
  undefined8 local_23c8;
  undefined8 uStack_23c0;
  undefined8 local_23b8;
  undefined8 uStack_23b0;
  undefined8 local_23a8;
  undefined8 uStack_23a0;
  undefined8 local_2398;
  undefined8 uStack_2390;
  undefined8 local_2378;
  undefined8 uStack_2370;
  undefined8 local_2368;
  undefined8 uStack_2360;
  undefined8 local_2358;
  undefined8 uStack_2350;
  undefined8 *local_2348;
  float *local_2340;
  float *local_2338;
  undefined1 (*local_2330) [16];
  float *local_2328;
  undefined1 (*local_2320) [16];
  undefined1 (*local_2310) [16];
  float *local_2308;
  undefined1 (*local_2300) [16];
  undefined1 (*local_22f8) [16];
  undefined1 (*local_22f0) [16];
  float *local_22d8;
  undefined1 *local_22d0;
  float *local_22c8;
  undefined1 *local_22c0;
  undefined8 *local_22b8;
  undefined8 *local_22b0;
  undefined8 local_22a8;
  undefined8 uStack_22a0;
  undefined8 local_2298;
  undefined8 uStack_2290;
  undefined8 local_2288;
  undefined8 uStack_2280;
  undefined8 local_2278;
  undefined8 uStack_2270;
  undefined8 local_2268;
  undefined8 uStack_2260;
  undefined8 local_2258;
  undefined8 uStack_2250;
  undefined8 local_2248;
  undefined8 uStack_2240;
  undefined8 local_2238;
  undefined8 uStack_2230;
  undefined8 local_2208;
  undefined8 uStack_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  undefined8 local_21e8;
  undefined8 uStack_21e0;
  undefined8 local_21d8;
  undefined8 uStack_21d0;
  undefined8 local_21c8;
  undefined8 uStack_21c0;
  undefined8 local_21b8;
  undefined8 uStack_21b0;
  undefined8 local_2198;
  undefined8 uStack_2190;
  undefined8 local_2188;
  undefined8 uStack_2180;
  undefined8 local_2178;
  undefined8 uStack_2170;
  undefined8 local_2168;
  undefined8 uStack_2160;
  undefined8 local_2158;
  undefined8 uStack_2150;
  undefined8 local_2148;
  undefined8 uStack_2140;
  undefined8 local_2138;
  undefined8 uStack_2130;
  undefined8 local_2128;
  undefined8 uStack_2120;
  undefined8 local_2118;
  undefined8 uStack_2110;
  undefined8 local_20e8;
  undefined8 uStack_20e0;
  undefined8 local_20d8;
  undefined8 uStack_20d0;
  undefined8 local_20c8;
  undefined8 uStack_20c0;
  undefined8 local_20b8;
  undefined8 uStack_20b0;
  undefined8 local_20a8;
  undefined8 uStack_20a0;
  undefined8 local_2098;
  undefined8 uStack_2090;
  undefined8 local_2048;
  undefined8 uStack_2040;
  undefined8 local_2038;
  undefined8 uStack_2030;
  undefined8 local_2028;
  undefined8 uStack_2020;
  undefined8 local_2018;
  undefined8 uStack_2010;
  undefined8 local_2008;
  undefined8 uStack_2000;
  undefined8 local_1ff8;
  undefined8 uStack_1ff0;
  undefined8 local_1fb8;
  undefined8 uStack_1fb0;
  undefined8 local_1fa8;
  undefined8 uStack_1fa0;
  undefined8 local_1f98;
  undefined8 uStack_1f90;
  undefined8 local_1f88;
  undefined8 uStack_1f80;
  undefined8 local_1f78;
  undefined8 uStack_1f70;
  undefined8 local_1f68;
  undefined8 uStack_1f60;
  undefined8 local_1f58;
  undefined8 uStack_1f50;
  undefined8 local_1f48;
  undefined8 uStack_1f40;
  undefined8 local_1f38;
  undefined8 uStack_1f30;
  undefined8 local_1f28;
  undefined8 uStack_1f20;
  undefined8 *local_1f10;
  undefined8 local_1f08;
  undefined8 uStack_1f00;
  undefined1 *local_1ef0;
  undefined8 local_1ee8;
  undefined8 uStack_1ee0;
  undefined1 *local_1ed0;
  undefined8 local_1ea8;
  undefined8 uStack_1ea0;
  undefined8 *local_1e90;
  undefined8 local_1e88;
  undefined8 uStack_1e80;
  float *local_1e70;
  undefined8 local_1e68;
  undefined8 uStack_1e60;
  float *local_1e50;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined1 (*local_1dd0) [16];
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  float *local_1db0;
  undefined8 local_1da8;
  undefined8 uStack_1da0;
  undefined1 (*local_1d90) [16];
  undefined8 local_1d88;
  undefined8 uStack_1d80;
  float *local_1d70;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  float *local_1d50;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  float *local_1d30;
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  undefined8 local_1d18;
  undefined8 uStack_1d10;
  undefined8 local_1d08;
  undefined8 uStack_1d00;
  undefined1 local_1cf8 [16];
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  float local_1cd4;
  float local_1cd0;
  int local_1ccc;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined1 local_1c98 [16];
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  int local_1c6c;
  int local_1c68;
  int local_1c64;
  float *local_1c60;
  float *local_1c58;
  undefined1 (*local_1c50) [16];
  float *local_1c48;
  undefined1 (*local_1c40) [16];
  float local_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  float local_1c28;
  float local_1c18;
  float fStack_1c14;
  float fStack_1c10;
  float fStack_1c0c;
  float local_1bfc;
  float local_1bf8;
  float fStack_1bf4;
  float fStack_1bf0;
  float fStack_1bec;
  float local_1be8;
  float local_1bd8;
  float fStack_1bd4;
  float fStack_1bd0;
  float fStack_1bcc;
  float local_1bbc;
  float *local_1bb8;
  float *local_1bb0;
  undefined1 (*local_1ba8) [16];
  undefined1 (*local_1ba0) [16];
  undefined1 (*local_1b98) [16];
  float *local_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined1 (*local_1b70) [16];
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined1 (*local_1b50) [16];
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined1 local_1b18 [16];
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  float local_1af4;
  float local_1af0;
  int local_1aec;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined1 local_1ab8 [16];
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  int local_1a8c;
  int local_1a88;
  int local_1a84;
  float *local_1a80;
  float *local_1a78;
  undefined1 (*local_1a70) [16];
  float *local_1a68;
  undefined1 (*local_1a60) [16];
  float local_1a58;
  float fStack_1a54;
  float fStack_1a50;
  float fStack_1a4c;
  float local_1a48;
  float local_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  float local_1a1c;
  float local_1a18;
  float fStack_1a14;
  float fStack_1a10;
  float fStack_1a0c;
  float local_1a08;
  float local_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  float local_19dc;
  float *local_19d8;
  float *local_19d0;
  undefined1 (*local_19c8) [16];
  undefined1 (*local_19c0) [16];
  undefined1 (*local_19b8) [16];
  float *local_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined1 (*local_1990) [16];
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined1 (*local_1970) [16];
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined1 local_1938 [16];
  undefined8 local_1928;
  undefined8 uStack_1920;
  float local_1914;
  float local_1910;
  int local_190c;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined1 local_18d8 [16];
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  int local_18ac;
  int local_18a8;
  int local_18a4;
  float *local_18a0;
  float *local_1898;
  undefined1 (*local_1890) [16];
  float *local_1888;
  undefined1 (*local_1880) [16];
  float local_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float local_1868;
  float local_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float local_183c;
  float local_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float local_1828;
  float local_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float local_17fc;
  float *local_17f8;
  float *local_17f0;
  undefined1 (*local_17e8) [16];
  undefined1 (*local_17e0) [16];
  undefined1 (*local_17d8) [16];
  float *local_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined1 (*local_17b0) [16];
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined1 (*local_1790) [16];
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  float local_1734;
  float local_1730;
  int local_172c;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  int local_16cc;
  int local_16c8;
  int local_16c4;
  float *local_16c0;
  float *local_16b8;
  float *local_16b0;
  float *local_16a8;
  float *local_16a0;
  float local_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  float local_1688;
  float local_1678;
  float fStack_1674;
  float fStack_1670;
  float fStack_166c;
  float local_165c;
  float local_1658;
  float fStack_1654;
  float fStack_1650;
  float fStack_164c;
  float local_1648;
  float local_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float local_161c;
  float *local_1618;
  float *local_1610;
  float *local_1608;
  float *local_1600;
  float *local_15f8;
  float *local_15f0;
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  float *local_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  float *local_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  int local_158c;
  undefined1 local_1588 [16];
  undefined8 local_1578;
  undefined8 uStack_1570;
  float local_1560;
  float local_155c;
  int local_1558;
  int local_1554;
  undefined1 (*local_1550) [16];
  float *local_1548;
  undefined1 (*local_1540) [16];
  float local_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float local_1528;
  float local_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float local_1508;
  undefined1 (*pauStack_1500) [16];
  undefined1 (*local_14f8) [16];
  float *local_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined1 (*local_14d0) [16];
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  int local_14ac;
  undefined1 local_14a8 [16];
  undefined8 local_1498;
  undefined8 uStack_1490;
  float local_1480;
  float local_147c;
  int local_1478;
  int local_1474;
  undefined1 (*local_1470) [16];
  float *local_1468;
  undefined1 (*local_1460) [16];
  float local_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float local_1448;
  float local_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float local_1428;
  undefined1 (*pauStack_1420) [16];
  undefined1 (*local_1418) [16];
  float *local_1410;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined1 (*local_13f0) [16];
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  int local_13cc;
  undefined1 local_13c8 [16];
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  float local_13a0;
  float local_139c;
  int local_1398;
  int local_1394;
  undefined1 (*local_1390) [16];
  float *local_1388;
  undefined1 (*local_1380) [16];
  float local_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float local_1368;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float local_1348;
  undefined1 (*pauStack_1340) [16];
  undefined1 (*local_1338) [16];
  float *local_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined1 (*local_1310) [16];
  undefined8 local_1308;
  undefined8 uStack_1300;
  int local_12ec;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  float local_12c0;
  float local_12bc;
  int local_12b8;
  int local_12b4;
  float *local_12b0;
  float *local_12a8;
  float *local_12a0;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float local_1288;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float local_1268;
  float *pfStack_1260;
  float *local_1258;
  float *local_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  float *local_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  float local_ea8;
  float fStack_ea4;
  float fStack_ea0;
  float fStack_e9c;
  float local_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float local_e88;
  float fStack_e84;
  float fStack_e80;
  float fStack_e7c;
  float local_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float local_e68;
  float fStack_e64;
  float fStack_e60;
  float fStack_e5c;
  float local_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float local_e48;
  float fStack_e44;
  float fStack_e40;
  float fStack_e3c;
  float local_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float local_e28;
  float fStack_e24;
  float fStack_e20;
  float fStack_e1c;
  float local_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float local_e08;
  float fStack_e04;
  float fStack_e00;
  float fStack_dfc;
  float local_df8;
  float fStack_df4;
  float fStack_df0;
  float fStack_dec;
  float local_de8;
  float fStack_de4;
  float fStack_de0;
  float fStack_ddc;
  float local_dd8;
  float fStack_dd4;
  float fStack_dd0;
  float fStack_dcc;
  float local_dc8;
  float fStack_dc4;
  float fStack_dc0;
  float fStack_dbc;
  float local_db8;
  float fStack_db4;
  float fStack_db0;
  float fStack_dac;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  float local_d28;
  float fStack_d24;
  float fStack_d20;
  float fStack_d1c;
  undefined8 local_d18;
  undefined8 uStack_d10;
  float local_d08;
  float fStack_d04;
  float fStack_d00;
  float fStack_cfc;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  float local_ce8;
  float fStack_ce4;
  float fStack_ce0;
  float fStack_cdc;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  float local_c88;
  float fStack_c84;
  float fStack_c80;
  float fStack_c7c;
  undefined8 local_c78;
  undefined8 uStack_c70;
  float local_c68;
  float fStack_c64;
  float fStack_c60;
  float fStack_c5c;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  float local_be8;
  float fStack_be4;
  float fStack_be0;
  float fStack_bdc;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  float local_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  float local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  float local_aa8;
  float fStack_aa4;
  float fStack_aa0;
  float fStack_a9c;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  float local_788;
  float fStack_784;
  float fStack_780;
  float fStack_77c;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  float local_648;
  float fStack_644;
  float fStack_640;
  float fStack_63c;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  long local_120;
  undefined4 local_114;
  long local_110;
  long local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  float *local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_78;
  undefined8 *local_58;
  
  local_2f84 = (int)in_RSI[5];
  local_2f88 = (int)in_RSI[3];
  local_2f8c = *(int *)((long)in_RSI + 0x2c);
  local_2f90 = (int)in_RSI[6];
  local_2f94 = (int)in_RSI[7];
  local_2f60 = (undefined8 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0);
  local_2fa0 = (float *)*local_2f60;
  local_2f68 = (undefined8 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x128);
  local_2fa8 = (float *)*local_2f68;
  local_2f78 = in_RSI;
  if (local_2f84 == 1) {
    local_2fac = local_2f8c * local_2f88;
    local_2fb8 = (undefined1 (*) [16])*in_RSI;
    local_2af4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
    local_2b38[0x10] = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
    local_29f8 = local_2b38;
    local_2a08 = 0;
    local_2a18 = 0;
    uStack_2a10 = 0;
    local_29f0 = local_2fb8;
    while( true ) {
      uVar2 = uStack_2230;
      uVar1 = local_2238;
      local_2238._0_4_ = (float)local_2a18;
      local_2238._4_4_ = (float)((ulong)local_2a18 >> 0x20);
      uStack_2230._0_4_ = (float)uStack_2a10;
      uStack_2230._4_4_ = (float)((ulong)uStack_2a10 >> 0x20);
      if (local_2fac < local_2a08 + 4) break;
      local_22f0 = local_29f0;
      local_2a28 = *(undefined8 *)*local_29f0;
      uStack_2a20 = *(undefined8 *)(*local_29f0 + 8);
      uVar1 = local_2a18;
      uVar2 = uStack_2a10;
      local_2248._0_4_ = (float)local_2a28;
      local_2248._4_4_ = (float)((ulong)local_2a28 >> 0x20);
      uStack_2240._0_4_ = (float)uStack_2a20;
      uStack_2240._4_4_ = (float)((ulong)uStack_2a20 >> 0x20);
      local_2a18 = CONCAT44(local_2238._4_4_ + local_2248._4_4_,
                            (float)local_2238 + (float)local_2248);
      uStack_2a10 = CONCAT44(uStack_2230._4_4_ + uStack_2240._4_4_,
                             (float)uStack_2230 + (float)uStack_2240);
      local_2a08 = local_2a08 + 4;
      local_29f0 = local_29f0 + 1;
      local_2248 = local_2a28;
      uStack_2240 = uStack_2a20;
      local_2238 = uVar1;
      uStack_2230 = uVar2;
    }
    local_2a2c = 0.0;
    for (; local_2a08 < local_2fac; local_2a08 = local_2a08 + 1) {
      local_2a2c = *(float *)*local_29f0 + local_2a2c;
      local_29f0 = (undefined1 (*) [16])(*local_29f0 + 4);
    }
    local_2b38[0] = 0.0;
    local_2b38[1] = 0.0;
    uStack_2b40 = 0;
    local_2b48 = 0;
    uStack_2b50 = 0;
    local_2b58 = 0;
    uStack_2b60 = 0;
    local_2b68 = 0;
    local_2b78 = ZEXT816(0);
    local_fe8 = (float)local_2238 + (float)uStack_2230;
    fStack_fe4 = local_2238._4_4_ + uStack_2230._4_4_;
    fStack_fe0 = (float)uStack_2230 + (float)uStack_2230;
    fStack_fdc = uStack_2230._4_4_ + uStack_2230._4_4_;
    local_e98 = local_fe8 + fStack_fe4;
    local_ff8 = CONCAT44(fStack_fe4,local_e98);
    uStack_ff0 = CONCAT44(fStack_fdc,fStack_fe0);
    local_2a2c = local_e98 + local_2a2c;
    local_2b38[0] = local_2a2c / (float)local_2fac;
    uStack_f90 = uStack_2a10;
    local_f98 = local_2a18;
    uStack_fa0 = uStack_2a10;
    local_fa8 = local_2a18;
    uStack_fb0 = uStack_2a10;
    local_fb8 = local_2a18;
    uStack_fc0 = uStack_2a10;
    local_fc8 = uStack_2a10;
    uStack_fd0 = uStack_2a10;
    local_fd8 = local_2a18;
    uStack_2390 = 0;
    local_2398 = 0;
    local_29fc = 1;
    local_2ad4 = 1;
    local_2b38[0xe] = 0.0;
    local_2b38[0xf] = 0.0;
    local_2b38[0xc] = 0.0;
    local_2b38[0xd] = 0.0;
    local_2b38[10] = 0.0;
    local_2b38[0xb] = 0.0;
    local_2b38[8] = 0.0;
    local_2b38[9] = 0.0;
    local_2b38[6] = 0.0;
    local_2b38[7] = 0.0;
    local_2b38[4] = 0.0;
    local_2b38[5] = 0.0;
    local_2848 = local_2b78;
    local_2850 = local_2b38;
    local_2854 = 1;
    local_2860 = local_2b38[0];
    local_2878 = CONCAT44(local_2b38[0],local_2b38[0]);
    uStack_2870 = CONCAT44(local_2b38[0],local_2b38[0]);
    local_2598 = local_2b38[0];
    fStack_259c = local_2b38[0];
    fStack_25a0 = local_2b38[0];
    fStack_25a4 = local_2b38[0];
    local_25a8 = local_2b38[0];
    local_287c = 0;
    local_23d8 = 0;
    uStack_23d0 = 0;
    local_2898 = 0;
    uStack_2890 = 0;
    local_2840 = local_2fb8;
    while( true ) {
      uVar4 = uStack_4c0;
      uVar3 = local_4c8;
      local_4c8._0_4_ = (float)local_2898;
      local_4c8._4_4_ = (float)((ulong)local_2898 >> 0x20);
      uStack_4c0._0_4_ = (float)uStack_2890;
      uStack_4c0._4_4_ = (float)((ulong)uStack_2890 >> 0x20);
      if (local_2fac < local_287c + 4) break;
      local_2310 = local_2840;
      uVar3 = *(undefined8 *)*local_2840;
      uVar4 = *(undefined8 *)(*local_2840 + 8);
      local_c38._0_4_ = (float)uVar3;
      local_c38._4_4_ = (float)((ulong)uVar3 >> 0x20);
      uStack_c30._0_4_ = (float)uVar4;
      uStack_c30._4_4_ = (float)((ulong)uVar4 >> 0x20);
      local_c38._0_4_ = (float)local_c38 - local_2b38[0];
      local_c38._4_4_ = local_c38._4_4_ - local_2b38[0];
      uStack_c30._0_4_ = (float)uStack_c30 - local_2b38[0];
      uStack_c30._4_4_ = uStack_c30._4_4_ - local_2b38[0];
      local_28a8 = CONCAT44(local_c38._4_4_,(float)local_c38);
      uStack_28a0 = CONCAT44(uStack_c30._4_4_,(float)uStack_c30);
      local_4d8 = local_28a8;
      uStack_4d0 = uStack_28a0;
      local_4e8 = local_28a8;
      uStack_4e0 = uStack_28a0;
      local_4f8 = local_2898;
      uStack_4f0 = uStack_2890;
      local_498 = local_28a8;
      uStack_490 = uStack_28a0;
      local_4a8 = local_28a8;
      uStack_4a0 = uStack_28a0;
      local_4b8 = (float)local_c38 * (float)local_c38;
      fStack_4b4 = local_c38._4_4_ * local_c38._4_4_;
      fStack_4b0 = (float)uStack_c30 * (float)uStack_c30;
      fStack_4ac = uStack_c30._4_4_ * uStack_c30._4_4_;
      uVar5 = local_2898;
      uVar6 = uStack_2890;
      local_2898 = CONCAT44(fStack_4b4 + local_4c8._4_4_,local_4b8 + (float)local_4c8);
      uStack_2890 = CONCAT44(fStack_4ac + uStack_4c0._4_4_,fStack_4b0 + (float)uStack_4c0);
      local_287c = local_287c + 4;
      local_2840 = local_2840 + 1;
      local_c48 = local_2878;
      uStack_c40 = uStack_2870;
      local_c38 = uVar3;
      uStack_c30 = uVar4;
      local_4c8 = uVar5;
      uStack_4c0 = uVar6;
    }
    local_28ac = 0.0;
    for (; local_287c < local_2fac; local_287c = local_287c + 1) {
      local_28b0 = *(float *)*local_2840 - local_2b38[0];
      local_28ac = local_28b0 * local_28b0 + local_28ac;
      local_2840 = (undefined1 (*) [16])(*local_2840 + 4);
    }
    local_1128 = (float)local_4c8 + (float)uStack_4c0;
    fStack_1124 = local_4c8._4_4_ + uStack_4c0._4_4_;
    fStack_1120 = (float)uStack_4c0 + (float)uStack_4c0;
    fStack_111c = uStack_4c0._4_4_ + uStack_4c0._4_4_;
    local_e18 = local_1128 + fStack_1124;
    local_1138 = CONCAT44(fStack_1124,local_e18);
    uStack_1130 = CONCAT44(fStack_111c,fStack_1120);
    local_28ac = local_e18 + local_28ac;
    local_2b78._0_4_ = local_28ac / (float)local_2fac;
    uStack_f10 = uStack_2890;
    local_f18 = local_2898;
    uStack_f20 = uStack_2890;
    local_f28 = local_2898;
    uStack_10f0 = uStack_2890;
    local_10f8 = local_2898;
    uStack_1100 = uStack_2890;
    local_1108 = uStack_2890;
    uStack_1110 = uStack_2890;
    local_1118 = local_2898;
    local_2b80 = (float *)local_2b78;
    local_2b88 = (undefined1 (*) [16])local_2b38;
    local_2b38[2] = 0.0;
    local_2b38[3] = 0.0;
    local_2af0 = local_2fa8;
    local_2ae8 = local_2fa0;
    local_2adc = local_2fac;
    local_2ad8 = local_2fac;
    local_2ad0 = local_2fb8;
    local_2a04 = local_2fac;
    local_2a00 = local_2fac;
    local_285c = local_2fac;
    local_2858 = local_2fac;
    local_2238 = uVar1;
    uStack_2230 = uVar2;
    local_ea8 = fStack_fe4;
    fStack_ea4 = fStack_fe4;
    fStack_ea0 = fStack_fe4;
    fStack_e9c = fStack_fe4;
    fStack_e94 = fStack_fe4;
    fStack_e90 = fStack_fe0;
    fStack_e8c = fStack_fdc;
    local_e28 = fStack_1124;
    fStack_e24 = fStack_1124;
    fStack_e20 = fStack_1124;
    fStack_e1c = fStack_1124;
    fStack_e14 = fStack_1124;
    fStack_e10 = fStack_1120;
    fStack_e0c = fStack_111c;
    local_da8 = local_ff8;
    uStack_da0 = uStack_ff0;
    local_d68 = local_1138;
    uStack_d60 = uStack_1130;
    local_4c8 = uVar3;
    uStack_4c0 = uVar4;
    dVar37 = std::sqrt((double)(ulong)(uint)((float)local_2b78._0_4_ + local_2b38[0x10]));
    *local_2b80 = 1.0 / SUB84(dVar37,0);
    *(float *)*local_2b88 = -local_2b38[0] * *local_2b80;
    if (local_2af4 == 0) {
      local_1540 = local_2ad0;
      local_1548 = local_2b80;
      local_1550 = local_2b88;
      local_1554 = local_2ad4;
      local_1558 = local_2adc;
      local_155c = *local_2b80;
      local_1560 = *(float *)*local_2b88;
      if (local_2ad4 == 4) {
        local_14f0 = local_2b80;
        local_30b8 = *(undefined8 *)local_2b80;
        uStack_30b0 = *(undefined8 *)(local_2b80 + 2);
      }
      else {
        local_30b8 = CONCAT44(local_155c,local_155c);
        uStack_30b0 = CONCAT44(local_155c,local_155c);
        local_1518 = local_155c;
        fStack_1514 = local_155c;
        fStack_1510 = local_155c;
        fStack_150c = local_155c;
        local_1508 = local_155c;
      }
      local_1578 = local_30b8;
      uStack_1570 = uStack_30b0;
      if (local_2ad4 == 4) {
        local_14f8 = local_2b88;
        local_30c8 = *(undefined8 *)*local_2b88;
        uStack_30c0 = *(undefined8 *)(*local_2b88 + 8);
      }
      else {
        local_30c8 = CONCAT44(local_1560,local_1560);
        uStack_30c0 = CONCAT44(local_1560,local_1560);
        local_1538 = local_1560;
        fStack_1534 = local_1560;
        fStack_1530 = local_1560;
        fStack_152c = local_1560;
        local_1528 = local_1560;
      }
      local_1588._8_8_ = uStack_30c0;
      local_1588._0_8_ = local_30c8;
      for (local_158c = 0; local_158c + 4 <= local_2adc; local_158c = local_158c + 4) {
        pauStack_1500 = local_1540;
        local_b18 = *(undefined8 *)*local_1540;
        uStack_b10 = *(undefined8 *)(*local_1540 + 8);
        local_b28 = local_30b8;
        uStack_b20 = uStack_30b0;
        local_b38 = local_30c8;
        uStack_b30 = uStack_30c0;
        local_218._0_4_ = (float)local_b18;
        local_218._4_4_ = (float)((ulong)local_b18 >> 0x20);
        uStack_210._0_4_ = (float)uStack_b10;
        uStack_210._4_4_ = (float)((ulong)uStack_b10 >> 0x20);
        local_228._0_4_ = (float)local_30b8;
        local_228._4_4_ = (float)((ulong)local_30b8 >> 0x20);
        uStack_220._0_4_ = (float)uStack_30b0;
        uStack_220._4_4_ = (float)((ulong)uStack_30b0 >> 0x20);
        local_af8 = (float)local_218 * (float)local_228;
        fStack_af4 = local_218._4_4_ * local_228._4_4_;
        fStack_af0 = (float)uStack_210 * (float)uStack_220;
        fStack_aec = uStack_210._4_4_ * uStack_220._4_4_;
        local_b08._0_4_ = (float)local_30c8;
        local_b08._4_4_ = (float)((ulong)local_30c8 >> 0x20);
        uStack_b00._0_4_ = (float)uStack_30c0;
        uStack_b00._4_4_ = (float)((ulong)uStack_30c0 >> 0x20);
        local_15a8 = CONCAT44(fStack_af4 + local_b08._4_4_,local_af8 + (float)local_b08);
        uStack_15a0 = CONCAT44(fStack_aec + uStack_b00._4_4_,fStack_af0 + (float)uStack_b00);
        local_14d0 = local_1540;
        local_14e8 = local_15a8;
        uStack_14e0 = uStack_15a0;
        auVar38._8_8_ = uStack_15a0;
        auVar38._0_8_ = local_15a8;
        *local_1540 = auVar38;
        local_1540 = local_1540 + 1;
        local_b08 = local_30c8;
        uStack_b00 = uStack_30c0;
        local_228 = local_30b8;
        uStack_220 = uStack_30b0;
        local_218 = local_b18;
        uStack_210 = uStack_b10;
      }
      for (; local_158c < local_2adc; local_158c = local_158c + 1) {
        *(float *)*local_1540 = *(float *)*local_1540 * local_155c + local_1560;
        local_1540 = (undefined1 (*) [16])(*local_1540 + 4);
      }
    }
    else {
      local_1c40 = local_2ad0;
      local_1c48 = local_2b80;
      local_1c50 = local_2b88;
      local_1c58 = local_2ae8;
      local_1c60 = local_2af0;
      local_1c64 = local_2ad4;
      local_1c68 = local_2adc;
      if (local_2ad4 == 4) {
        local_1c6c = 0;
        local_1b90 = local_2b80;
        local_1c88 = *(undefined8 *)local_2b80;
        uStack_1c80 = *(undefined8 *)(local_2b80 + 2);
        local_1b98 = local_2b88;
        local_1c98 = *local_2b88;
        for (; local_1c6c + 4 <= local_2adc; local_1c6c = local_1c6c + 4) {
          local_1ba0 = local_1c40;
          local_6b8 = *(undefined8 *)*local_1c40;
          uStack_6b0 = *(undefined8 *)(*local_1c40 + 8);
          local_1bd8 = *local_1c58;
          local_1cb8 = CONCAT44(local_1bd8,local_1bd8);
          uStack_1cb0 = CONCAT44(local_1bd8,local_1bd8);
          local_1bf8 = *local_1c60;
          local_1cc8 = CONCAT44(local_1bf8,local_1bf8);
          uStack_1cc0 = CONCAT44(local_1bf8,local_1bf8);
          local_6d8 = local_1c98._0_8_;
          uStack_6d0 = local_1c98._8_8_;
          local_3d8._0_4_ = (float)local_6b8;
          local_3d8._4_4_ = (float)((ulong)local_6b8 >> 0x20);
          uStack_3d0._0_4_ = (float)uStack_6b0;
          uStack_3d0._4_4_ = (float)((ulong)uStack_6b0 >> 0x20);
          local_3e8._0_4_ = (float)local_1c88;
          local_3e8._4_4_ = (float)((ulong)local_1c88 >> 0x20);
          uStack_3e0._0_4_ = (float)uStack_1c80;
          uStack_3e0._4_4_ = (float)((ulong)uStack_1c80 >> 0x20);
          local_698 = (float)local_3d8 * (float)local_3e8;
          fStack_694 = local_3d8._4_4_ * local_3e8._4_4_;
          fStack_690 = (float)uStack_3d0 * (float)uStack_3e0;
          fStack_68c = uStack_3d0._4_4_ * uStack_3e0._4_4_;
          local_6a8._0_4_ = local_1c98._0_4_;
          local_6a8._4_4_ = local_1c98._4_4_;
          uStack_6a0._0_4_ = local_1c98._8_4_;
          uStack_6a0._4_4_ = local_1c98._12_4_;
          local_1ca8 = CONCAT44(fStack_694 + local_6a8._4_4_,local_698 + (float)local_6a8);
          uStack_1ca0 = CONCAT44(fStack_68c + uStack_6a0._4_4_,fStack_690 + (float)uStack_6a0);
          local_708 = local_1ca8;
          uStack_700 = uStack_1ca0;
          local_3b8 = local_1ca8;
          uStack_3b0 = uStack_1ca0;
          local_6e8 = (local_698 + (float)local_6a8) * local_1bd8;
          fStack_6e4 = (fStack_694 + local_6a8._4_4_) * local_1bd8;
          fStack_6e0 = (fStack_690 + (float)uStack_6a0) * local_1bd8;
          fStack_6dc = (fStack_68c + uStack_6a0._4_4_) * local_1bd8;
          local_1ca8 = CONCAT44(fStack_6e4 + local_1bf8,local_6e8 + local_1bf8);
          uStack_1ca0 = CONCAT44(fStack_6dc + local_1bf8,fStack_6e0 + local_1bf8);
          local_1b50 = local_1c40;
          local_1b68 = local_1ca8;
          uStack_1b60 = uStack_1ca0;
          auVar26._8_8_ = uStack_1ca0;
          auVar26._0_8_ = local_1ca8;
          *local_1c40 = auVar26;
          local_1c40 = local_1c40 + 1;
          local_1c58 = local_1c58 + 1;
          local_1c60 = local_1c60 + 1;
          fStack_1bf4 = local_1bf8;
          fStack_1bf0 = local_1bf8;
          fStack_1bec = local_1bf8;
          local_1be8 = local_1bf8;
          fStack_1bd4 = local_1bd8;
          fStack_1bd0 = local_1bd8;
          fStack_1bcc = local_1bd8;
          local_1bbc = local_1bd8;
          local_728 = local_1cc8;
          uStack_720 = uStack_1cc0;
          local_718 = local_1cb8;
          uStack_710 = uStack_1cb0;
          local_6f8 = local_1cc8;
          uStack_6f0 = uStack_1cc0;
          local_6c8 = local_1c88;
          uStack_6c0 = uStack_1c80;
          local_6a8 = local_1c98._0_8_;
          uStack_6a0 = local_1c98._8_8_;
          local_3e8 = local_1c88;
          uStack_3e0 = uStack_1c80;
          local_3d8 = local_6b8;
          uStack_3d0 = uStack_6b0;
          local_3c8 = local_1cb8;
          uStack_3c0 = uStack_1cb0;
        }
      }
      if (local_2ad4 == 1) {
        local_1ccc = 0;
        local_1cd0 = *local_2b80;
        local_1cd4 = *(float *)*local_2b88;
        local_1ce8 = CONCAT44(local_1cd0,local_1cd0);
        uStack_1ce0 = CONCAT44(local_1cd0,local_1cd0);
        uVar1 = CONCAT44(local_1cd4,local_1cd4);
        local_1cf8._8_4_ = local_1cd4;
        local_1cf8._0_8_ = uVar1;
        local_1cf8._12_4_ = local_1cd4;
        for (; local_1ccc + 4 <= local_2adc; local_1ccc = local_1ccc + 4) {
          local_1ba8 = local_1c40;
          local_618 = *(undefined8 *)*local_1c40;
          uStack_610 = *(undefined8 *)(*local_1c40 + 8);
          local_1bb0 = local_1c58;
          local_1d18 = *(undefined8 *)local_1c58;
          uStack_1d10 = *(undefined8 *)(local_1c58 + 2);
          local_1bb8 = local_1c60;
          local_1d28 = *(undefined8 *)local_1c60;
          uStack_1d20 = *(undefined8 *)(local_1c60 + 2);
          uStack_630 = local_1cf8._8_8_;
          local_418._0_4_ = (float)local_618;
          local_418._4_4_ = (float)((ulong)local_618 >> 0x20);
          uStack_410._0_4_ = (float)uStack_610;
          uStack_410._4_4_ = (float)((ulong)uStack_610 >> 0x20);
          local_5f8 = (float)local_418 * local_1cd0;
          fStack_5f4 = local_418._4_4_ * local_1cd0;
          fStack_5f0 = (float)uStack_410 * local_1cd0;
          fStack_5ec = uStack_410._4_4_ * local_1cd0;
          uStack_600 = local_1cf8._8_8_;
          local_1d08 = CONCAT44(fStack_5f4 + local_1cd4,local_5f8 + local_1cd4);
          uStack_1d00 = CONCAT44(fStack_5ec + local_1cd4,fStack_5f0 + local_1cd4);
          local_668 = local_1d08;
          uStack_660 = uStack_1d00;
          local_3f8 = local_1d08;
          uStack_3f0 = uStack_1d00;
          local_408._0_4_ = (float)local_1d18;
          local_408._4_4_ = (float)((ulong)local_1d18 >> 0x20);
          uStack_400._0_4_ = (float)uStack_1d10;
          uStack_400._4_4_ = (float)((ulong)uStack_1d10 >> 0x20);
          local_648 = (local_5f8 + local_1cd4) * (float)local_408;
          fStack_644 = (fStack_5f4 + local_1cd4) * local_408._4_4_;
          fStack_640 = (fStack_5f0 + local_1cd4) * (float)uStack_400;
          fStack_63c = (fStack_5ec + local_1cd4) * uStack_400._4_4_;
          local_658._0_4_ = (float)local_1d28;
          local_658._4_4_ = (float)((ulong)local_1d28 >> 0x20);
          uStack_650._0_4_ = (float)uStack_1d20;
          uStack_650._4_4_ = (float)((ulong)uStack_1d20 >> 0x20);
          local_1d08 = CONCAT44(fStack_644 + local_658._4_4_,local_648 + (float)local_658);
          uStack_1d00 = CONCAT44(fStack_63c + uStack_650._4_4_,fStack_640 + (float)uStack_650);
          local_1b70 = local_1c40;
          local_1b88 = local_1d08;
          uStack_1b80 = uStack_1d00;
          auVar25._8_8_ = uStack_1d00;
          auVar25._0_8_ = local_1d08;
          *local_1c40 = auVar25;
          local_1c40 = local_1c40 + 1;
          local_1c58 = local_1c58 + 4;
          local_1c60 = local_1c60 + 4;
          local_688 = local_1d28;
          uStack_680 = uStack_1d20;
          local_678 = local_1d18;
          uStack_670 = uStack_1d10;
          local_658 = local_1d28;
          uStack_650 = uStack_1d20;
          local_638 = uVar1;
          local_628 = local_1ce8;
          uStack_620 = uStack_1ce0;
          local_608 = uVar1;
          local_428 = local_1ce8;
          uStack_420 = uStack_1ce0;
          local_418 = local_618;
          uStack_410 = uStack_610;
          local_408 = local_1d18;
          uStack_400 = uStack_1d10;
        }
        for (; local_1c38 = local_1cd4, fStack_1c34 = local_1cd4, fStack_1c30 = local_1cd4,
            fStack_1c2c = local_1cd4, local_1c28 = local_1cd4, local_1c18 = local_1cd0,
            fStack_1c14 = local_1cd0, fStack_1c10 = local_1cd0, fStack_1c0c = local_1cd0,
            local_1bfc = local_1cd0, local_1ccc < local_2adc; local_1ccc = local_1ccc + 1) {
          *(float *)*local_1c40 =
               (*(float *)*local_1c40 * local_1cd0 + local_1cd4) * *local_1c58 + *local_1c60;
          local_1c40 = (undefined1 (*) [16])(*local_1c40 + 4);
          local_1c58 = local_1c58 + 1;
          local_1c60 = local_1c60 + 1;
        }
      }
    }
  }
  if (local_2f84 == 2) {
    for (local_2fbc = 0; local_2fbc < local_2f90; local_2fbc = local_2fbc + 1) {
      local_2ab0 = local_2f78;
      local_2ab4 = local_2fbc;
      local_2fc8 = (undefined1 (*) [16])
                   (*local_2f78 +
                   (long)*(int *)((long)local_2f78 + 0x2c) * (long)local_2fbc * local_2f78[2]);
      local_2bfc = local_2f8c * local_2f88;
      local_2c14 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
      local_2c58[0x10] = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      local_2bf4 = local_2f88;
      local_2bf8 = local_2f8c;
      local_2c08 = local_2fa0;
      local_2c10 = local_2fa8;
      local_2c58[0xc] = 0.0;
      local_2c58[0xd] = 0.0;
      local_2c58[0xe] = 0.0;
      local_2c58[0xf] = 0.0;
      local_2c58[8] = 0.0;
      local_2c58[9] = 0.0;
      local_2c58[10] = 0.0;
      local_2c58[0xb] = 0.0;
      local_2c58[4] = 0.0;
      local_2c58[5] = 0.0;
      local_2c58[6] = 0.0;
      local_2c58[7] = 0.0;
      local_2c58[0] = 0.0;
      local_2c58[1] = 0.0;
      local_2c58[2] = 0.0;
      local_2c58[3] = 0.0;
      local_2c68 = 0;
      uStack_2c60 = 0;
      local_2c78 = 0;
      uStack_2c70 = 0;
      local_2c88 = 0;
      uStack_2c80 = 0;
      local_2c98 = ZEXT816(0);
      local_2998 = local_2c58;
      local_299c = local_2f88;
      local_29a0 = local_2f8c;
      local_29a8 = 0;
      local_23a8 = 0;
      uStack_23a0 = 0;
      local_29b8 = 0;
      uStack_29b0 = 0;
      local_2990 = local_2fc8;
      while( true ) {
        uVar2 = uStack_2250;
        uVar1 = local_2258;
        local_2258._0_4_ = (float)local_29b8;
        local_2258._4_4_ = (float)((ulong)local_29b8 >> 0x20);
        uStack_2250._0_4_ = (float)uStack_29b0;
        uStack_2250._4_4_ = (float)((ulong)uStack_29b0 >> 0x20);
        if (local_2bfc < local_29a8 + 4) break;
        local_22f8 = local_2990;
        local_29c8 = *(undefined8 *)*local_2990;
        uStack_29c0 = *(undefined8 *)(*local_2990 + 8);
        uVar1 = local_29b8;
        uVar2 = uStack_29b0;
        local_2268._0_4_ = (float)local_29c8;
        local_2268._4_4_ = (float)((ulong)local_29c8 >> 0x20);
        uStack_2260._0_4_ = (float)uStack_29c0;
        uStack_2260._4_4_ = (float)((ulong)uStack_29c0 >> 0x20);
        local_29b8 = CONCAT44(local_2258._4_4_ + local_2268._4_4_,
                              (float)local_2258 + (float)local_2268);
        uStack_29b0 = CONCAT44(uStack_2250._4_4_ + uStack_2260._4_4_,
                               (float)uStack_2250 + (float)uStack_2260);
        local_29a8 = local_29a8 + 4;
        local_2990 = local_2990 + 1;
        local_2268 = local_29c8;
        uStack_2260 = uStack_29c0;
        local_2258 = uVar1;
        uStack_2250 = uVar2;
      }
      local_29cc = 0.0;
      for (; local_29a8 < local_2bfc; local_29a8 = local_29a8 + 1) {
        local_29cc = *(float *)*local_2990 + local_29cc;
        local_2990 = (undefined1 (*) [16])(*local_2990 + 4);
      }
      if (local_2f88 == 4) {
        local_2548 = (float)local_2f8c;
        local_20a8 = CONCAT44(local_2548,local_2548);
        uStack_20a0 = CONCAT44(local_2548,local_2548);
        local_2098 = local_29b8;
        uStack_2090 = uStack_29b0;
        auVar18._8_8_ = uStack_29b0;
        auVar18._0_8_ = local_29b8;
        auVar17._8_8_ = uStack_20a0;
        auVar17._0_8_ = local_20a8;
        auVar38 = divps(auVar18,auVar17);
        local_29e8._0_8_ = auVar38._0_8_;
        local_29e8._8_8_ = auVar38._8_8_;
        local_1e68 = local_29e8._0_8_;
        uStack_1e60 = local_29e8._8_8_;
        local_2c58[0] = (float)local_29e8._0_4_;
        local_2c58[1] = (float)local_29e8._4_4_;
        local_2c58[2] = (float)local_29e8._8_4_;
        local_2c58[3] = (float)local_29e8._12_4_;
        local_29e8 = auVar38;
        fStack_2544 = local_2548;
        fStack_2540 = local_2548;
        fStack_253c = local_2548;
        local_2538 = local_2548;
        local_1e50 = local_2998;
      }
      if (local_2f88 == 1) {
        local_1028 = local_29b8;
        uStack_1020 = uStack_29b0;
        local_f78 = local_29b8;
        uStack_f70 = uStack_29b0;
        local_f88 = local_29b8;
        uStack_f80 = uStack_29b0;
        local_1008 = local_29b8;
        uStack_1000 = uStack_29b0;
        local_1018 = uStack_29b0;
        uStack_1010 = uStack_29b0;
        local_1038 = (float)local_2258 + (float)uStack_2250;
        fStack_1034 = local_2258._4_4_ + uStack_2250._4_4_;
        fStack_1030 = (float)uStack_2250 + (float)uStack_2250;
        fStack_102c = uStack_2250._4_4_ + uStack_2250._4_4_;
        local_e78 = local_1038 + fStack_1034;
        local_1048 = CONCAT44(fStack_1034,local_e78);
        uStack_1040 = CONCAT44(fStack_102c,fStack_1030);
        local_29cc = local_e78 + local_29cc;
        local_2c58[0] = local_29cc / (float)local_2f8c;
        local_e88 = fStack_1034;
        fStack_e84 = fStack_1034;
        fStack_e80 = fStack_1034;
        fStack_e7c = fStack_1034;
        fStack_e74 = fStack_1034;
        fStack_e70 = fStack_1030;
        fStack_e6c = fStack_102c;
        local_d98 = local_1048;
        uStack_d90 = uStack_1040;
      }
      local_27b8 = local_2c98;
      local_27c0 = local_2c58;
      local_27c4 = local_2f88;
      local_27c8 = local_2f8c;
      fVar36 = local_2c58[0];
      local_27d0 = local_2c58[0];
      if (local_2f88 == 4) {
        local_30e8._0_4_ = local_2c58[0];
        local_30e8._4_4_ = local_2c58[1];
        uStack_30e0._0_4_ = local_2c58[2];
        uStack_30e0._4_4_ = local_2c58[3];
        local_2328 = local_27c0;
      }
      else {
        local_30e8._4_4_ = local_2c58[0];
        local_30e8._0_4_ = local_2c58[0];
        uStack_30e0._4_4_ = local_2c58[0];
        uStack_30e0._0_4_ = local_2c58[0];
        local_25e8 = local_27d0;
        fStack_25e4 = local_27d0;
        fStack_25e0 = local_27d0;
        fStack_25dc = local_27d0;
        local_25d8 = local_27d0;
      }
      local_27e8 = local_30e8;
      uStack_27e0 = uStack_30e0;
      local_27ec = 0;
      local_23e8 = 0;
      uStack_23e0 = 0;
      local_2808 = 0;
      uStack_2800 = 0;
      local_27b0 = local_2fc8;
      while( true ) {
        uVar4 = uStack_510;
        uVar3 = local_518;
        local_518._0_4_ = (float)local_2808;
        local_518._4_4_ = (float)((ulong)local_2808 >> 0x20);
        uStack_510._0_4_ = (float)uStack_2800;
        uStack_510._4_4_ = (float)((ulong)uStack_2800 >> 0x20);
        if (local_2bfc < local_27ec + 4) break;
        local_2320 = local_27b0;
        uVar3 = *(undefined8 *)*local_27b0;
        uVar4 = *(undefined8 *)(*local_27b0 + 8);
        local_c58._0_4_ = (float)uVar3;
        local_c58._4_4_ = (float)((ulong)uVar3 >> 0x20);
        uStack_c50._0_4_ = (float)uVar4;
        uStack_c50._4_4_ = (float)((ulong)uVar4 >> 0x20);
        local_c68 = (float)local_30e8;
        fStack_c64 = SUB84(local_30e8,4);
        fStack_c60 = (float)uStack_30e0;
        fStack_c5c = SUB84(uStack_30e0,4);
        local_c58._0_4_ = (float)local_c58 - local_c68;
        local_c58._4_4_ = local_c58._4_4_ - fStack_c64;
        uStack_c50._0_4_ = (float)uStack_c50 - fStack_c60;
        uStack_c50._4_4_ = uStack_c50._4_4_ - fStack_c5c;
        local_2818 = CONCAT44(local_c58._4_4_,(float)local_c58);
        uStack_2810 = CONCAT44(uStack_c50._4_4_,(float)uStack_c50);
        local_528 = local_2818;
        uStack_520 = uStack_2810;
        local_538 = local_2818;
        uStack_530 = uStack_2810;
        local_548 = local_2808;
        uStack_540 = uStack_2800;
        local_478 = local_2818;
        uStack_470 = uStack_2810;
        local_488 = local_2818;
        uStack_480 = uStack_2810;
        local_508 = (float)local_c58 * (float)local_c58;
        fStack_504 = local_c58._4_4_ * local_c58._4_4_;
        fStack_500 = (float)uStack_c50 * (float)uStack_c50;
        fStack_4fc = uStack_c50._4_4_ * uStack_c50._4_4_;
        uVar5 = local_2808;
        uVar6 = uStack_2800;
        local_2808 = CONCAT44(fStack_504 + local_518._4_4_,local_508 + (float)local_518);
        uStack_2800 = CONCAT44(fStack_4fc + uStack_510._4_4_,fStack_500 + (float)uStack_510);
        local_27ec = local_27ec + 4;
        local_27b0 = local_27b0 + 1;
        _local_c68 = local_30e8;
        _fStack_c60 = uStack_30e0;
        local_c58 = uVar3;
        uStack_c50 = uVar4;
        local_518 = uVar5;
        uStack_510 = uVar6;
      }
      local_281c = 0.0;
      for (; local_27ec < local_2bfc; local_27ec = local_27ec + 1) {
        local_2820 = *(float *)*local_27b0 - fVar36;
        local_281c = local_2820 * local_2820 + local_281c;
        local_27b0 = (undefined1 (*) [16])(*local_27b0 + 4);
      }
      if (local_2f88 == 4) {
        local_2608 = (float)local_2f8c;
        local_2128 = CONCAT44(local_2608,local_2608);
        uStack_2120 = CONCAT44(local_2608,local_2608);
        local_2118 = local_2808;
        uStack_2110 = uStack_2800;
        auVar12._8_8_ = uStack_2800;
        auVar12._0_8_ = local_2808;
        auVar11._8_8_ = uStack_2120;
        auVar11._0_8_ = local_2128;
        local_2838 = divps(auVar12,auVar11);
        local_1ee8 = local_2838._0_8_;
        uStack_1ee0 = local_2838._8_8_;
        local_2c98 = local_2838;
        fStack_2604 = local_2608;
        fStack_2600 = local_2608;
        fStack_25fc = local_2608;
        local_25f8 = local_2608;
        local_1ed0 = local_27b8;
      }
      if (local_2f88 == 1) {
        local_1168 = local_2808;
        uStack_1160 = uStack_2800;
        local_ef8 = local_2808;
        uStack_ef0 = uStack_2800;
        local_f08 = local_2808;
        uStack_f00 = uStack_2800;
        local_1148 = local_2808;
        uStack_1140 = uStack_2800;
        local_1158 = uStack_2800;
        uStack_1150 = uStack_2800;
        local_1178 = (float)local_518 + (float)uStack_510;
        fStack_1174 = local_518._4_4_ + uStack_510._4_4_;
        fStack_1170 = (float)uStack_510 + (float)uStack_510;
        fStack_116c = uStack_510._4_4_ + uStack_510._4_4_;
        local_df8 = local_1178 + fStack_1174;
        local_1188 = CONCAT44(fStack_1174,local_df8);
        uStack_1180 = CONCAT44(fStack_116c,fStack_1170);
        local_281c = local_df8 + local_281c;
        local_2c98._0_4_ = local_281c / (float)local_2f8c;
        local_e08 = fStack_1174;
        fStack_e04 = fStack_1174;
        fStack_e00 = fStack_1174;
        fStack_dfc = fStack_1174;
        fStack_df4 = fStack_1174;
        fStack_df0 = fStack_1170;
        fStack_dec = fStack_116c;
        local_d58 = local_1188;
        uStack_d50 = uStack_1180;
      }
      local_2ca0 = (float *)local_2c98;
      local_2ca8 = (undefined1 (*) [16])local_2c58;
      if (local_2f88 == 4) {
        local_248c = 0x3f800000;
        local_24a8 = 0x3f800000;
        uStack_24a4 = 0x3f800000;
        uStack_24a0 = 0x3f800000;
        uStack_249c = 0x3f800000;
        local_2038 = 0x3f8000003f800000;
        uStack_2030 = 0x3f8000003f800000;
        local_2cc8 = CONCAT44(local_2c58[0x10],local_2c58[0x10]);
        uStack_2cc0 = CONCAT44(local_2c58[0x10],local_2c58[0x10]);
        local_2378 = 0;
        uStack_2370 = 0;
        local_22d0 = local_2c98;
        uVar5 = local_2c98._0_8_;
        uVar6 = local_2c98._8_8_;
        local_21f8._0_4_ = local_2c98._0_4_;
        local_21f8._4_4_ = local_2c98._4_4_;
        uStack_21f0._0_4_ = local_2c98._8_4_;
        uStack_21f0._4_4_ = local_2c98._12_4_;
        local_2ce8 = CONCAT44(local_21f8._4_4_ + local_2c58[0x10],
                              (float)local_21f8 + local_2c58[0x10]);
        uStack_2ce0 = CONCAT44(uStack_21f0._4_4_ + local_2c58[0x10],
                               (float)uStack_21f0 + local_2c58[0x10]);
        local_2198 = local_2ce8;
        uStack_2190 = uStack_2ce0;
        auVar42._8_8_ = uStack_2ce0;
        auVar42._0_8_ = local_2ce8;
        auVar38 = rsqrtps(in_XMM3,auVar42);
        fVar35 = ((float)local_21f8 + local_2c58[0x10]) * auVar38._0_4_;
        fVar39 = (local_21f8._4_4_ + local_2c58[0x10]) * auVar38._4_4_;
        fVar40 = ((float)uStack_21f0 + local_2c58[0x10]) * auVar38._8_4_;
        fVar41 = (uStack_21f0._4_4_ + local_2c58[0x10]) * auVar38._12_4_;
        auVar42 = auVar42 & _DAT_01f1a120;
        local_2cf8 = -(uint)(1.1754944e-38 <= auVar42._0_4_) &
                     (uint)(fVar35 * -0.5 * (fVar35 * auVar38._0_4_ + (float)DAT_01f1e9e0));
        uStack_2cf4 = -(uint)(1.1754944e-38 <= auVar42._4_4_) &
                      (uint)(fVar39 * -0.5 * (fVar39 * auVar38._4_4_ + DAT_01f1e9e0._4_4_));
        uStack_2cf0 = -(uint)(1.1754944e-38 <= auVar42._8_4_) &
                      (uint)(fVar40 * -0.5 * (fVar40 * auVar38._8_4_ + DAT_01f1e9e0._8_4_));
        uStack_2cec = -(uint)(1.1754944e-38 <= auVar42._12_4_) &
                      (uint)(fVar41 * -0.5 * (fVar41 * auVar38._12_4_ + DAT_01f1e9e0._12_4_));
        local_2048 = CONCAT44(uStack_2cf4,local_2cf8);
        uStack_2040 = CONCAT44(uStack_2cec,uStack_2cf0);
        auVar20._8_8_ = 0x3f8000003f800000;
        auVar20._0_8_ = 0x3f8000003f800000;
        auVar19._8_8_ = uStack_2040;
        auVar19._0_8_ = local_2048;
        local_2cb8 = divps(auVar20,auVar19);
        local_22d8 = local_2c58;
        local_2d08._0_4_ = local_2c58[0];
        local_2d08._4_4_ = local_2c58[1];
        uStack_2d00._0_4_ = local_2c58[2];
        uStack_2d00._4_4_ = local_2c58[3];
        local_1fa8 = local_2cb8._0_8_;
        uStack_1fa0 = local_2cb8._8_8_;
        local_1fb8 = 0;
        uStack_1fb0 = 0;
        local_168 = local_2cb8._0_8_;
        uVar33 = local_168;
        uStack_160 = local_2cb8._8_8_;
        uVar34 = uStack_160;
        fStack_154 = SUB84(local_2c58._0_8_,4);
        fStack_150 = (float)local_2c58._8_8_;
        fStack_14c = SUB84(local_2c58._8_8_,4);
        local_168._0_4_ = local_2cb8._0_4_;
        local_168._4_4_ = local_2cb8._4_4_;
        uStack_160._0_4_ = local_2cb8._8_4_;
        uStack_160._4_4_ = local_2cb8._12_4_;
        local_ce8 = fVar36 * (float)local_168;
        fStack_ce4 = fStack_154 * local_168._4_4_;
        fStack_ce0 = fStack_150 * (float)uStack_160;
        fStack_cdc = fStack_14c * uStack_160._4_4_;
        local_cd8 = 0;
        uStack_cd0 = 0;
        fStack_2cd4 = 0.0 - fStack_ce4;
        local_2cd8 = 0.0 - local_ce8;
        fStack_2ccc = 0.0 - fStack_cdc;
        fStack_2cd0 = 0.0 - fStack_ce0;
        local_1dc8 = local_2cb8._0_8_;
        uStack_1dc0 = local_2cb8._8_8_;
        local_2c98 = local_2cb8;
        local_1de8 = _local_2cd8;
        uStack_1de0 = _fStack_2cd0;
        local_2c58[2] = 0.0 - fStack_ce0;
        local_2c58[3] = 0.0 - fStack_cdc;
        local_2c58[0] = 0.0 - local_ce8;
        local_2c58[1] = 0.0 - fStack_ce4;
        in_XMM3 = _DAT_01f1e9e0;
        local_24c8 = local_2c58[0x10];
        fStack_24c4 = local_2c58[0x10];
        fStack_24c0 = local_2c58[0x10];
        fStack_24bc = local_2c58[0x10];
        local_24ac = local_2c58[0x10];
        local_2208 = local_2cc8;
        uStack_2200 = uStack_2cc0;
        local_21f8 = uVar5;
        uStack_21f0 = uVar6;
        local_1f98 = local_2d08;
        uStack_1f90 = uStack_2d00;
        local_1dd0 = local_2ca8;
        local_1db0 = local_2ca0;
        local_168 = uVar33;
        uStack_160 = uVar34;
        local_158 = local_2d08;
        _fStack_150 = uStack_2d00;
      }
      local_2bf0 = local_2fc8;
      local_29a4 = local_2bfc;
      local_27cc = local_2bfc;
      local_2258 = uVar1;
      uStack_2250 = uVar2;
      local_518 = uVar3;
      uStack_510 = uVar4;
      if (local_2f88 == 1) {
        dVar37 = std::sqrt((double)(ulong)(uint)((float)local_2c98._0_4_ + local_2c58[0x10]));
        *local_2ca0 = 1.0 / SUB84(dVar37,0);
        *(float *)*local_2ca8 = -local_2c58[0] * *local_2ca0;
      }
      if (local_2c14 == 0) {
        local_1460 = local_2bf0;
        local_1468 = local_2ca0;
        local_1470 = local_2ca8;
        local_1474 = local_2bf4;
        local_1478 = local_2bfc;
        local_147c = *local_2ca0;
        local_1480 = *(float *)*local_2ca8;
        if (local_2bf4 == 4) {
          local_1410 = local_2ca0;
          local_30f8 = *(undefined8 *)local_2ca0;
          uStack_30f0 = *(undefined8 *)(local_2ca0 + 2);
        }
        else {
          local_30f8 = CONCAT44(local_147c,local_147c);
          uStack_30f0 = CONCAT44(local_147c,local_147c);
          local_1438 = local_147c;
          fStack_1434 = local_147c;
          fStack_1430 = local_147c;
          fStack_142c = local_147c;
          local_1428 = local_147c;
        }
        local_1498 = local_30f8;
        uStack_1490 = uStack_30f0;
        if (local_2bf4 == 4) {
          local_1418 = local_2ca8;
          local_3108 = *(undefined8 *)*local_2ca8;
          uStack_3100 = *(undefined8 *)(*local_2ca8 + 8);
        }
        else {
          local_3108 = CONCAT44(local_1480,local_1480);
          uStack_3100 = CONCAT44(local_1480,local_1480);
          local_1458 = local_1480;
          fStack_1454 = local_1480;
          fStack_1450 = local_1480;
          fStack_144c = local_1480;
          local_1448 = local_1480;
        }
        local_14a8._8_8_ = uStack_3100;
        local_14a8._0_8_ = local_3108;
        for (local_14ac = 0; local_14ac + 4 <= local_2bfc; local_14ac = local_14ac + 4) {
          pauStack_1420 = local_1460;
          local_b68 = *(undefined8 *)*local_1460;
          uStack_b60 = *(undefined8 *)(*local_1460 + 8);
          local_b78 = local_30f8;
          uStack_b70 = uStack_30f0;
          local_b88 = local_3108;
          uStack_b80 = uStack_3100;
          local_1f8._0_4_ = (float)local_b68;
          local_1f8._4_4_ = (float)((ulong)local_b68 >> 0x20);
          uStack_1f0._0_4_ = (float)uStack_b60;
          uStack_1f0._4_4_ = (float)((ulong)uStack_b60 >> 0x20);
          local_208._0_4_ = (float)local_30f8;
          local_208._4_4_ = (float)((ulong)local_30f8 >> 0x20);
          uStack_200._0_4_ = (float)uStack_30f0;
          uStack_200._4_4_ = (float)((ulong)uStack_30f0 >> 0x20);
          local_b48 = (float)local_1f8 * (float)local_208;
          fStack_b44 = local_1f8._4_4_ * local_208._4_4_;
          fStack_b40 = (float)uStack_1f0 * (float)uStack_200;
          fStack_b3c = uStack_1f0._4_4_ * uStack_200._4_4_;
          local_b58._0_4_ = (float)local_3108;
          local_b58._4_4_ = (float)((ulong)local_3108 >> 0x20);
          uStack_b50._0_4_ = (float)uStack_3100;
          uStack_b50._4_4_ = (float)((ulong)uStack_3100 >> 0x20);
          local_14c8 = CONCAT44(fStack_b44 + local_b58._4_4_,local_b48 + (float)local_b58);
          uStack_14c0 = CONCAT44(fStack_b3c + uStack_b50._4_4_,fStack_b40 + (float)uStack_b50);
          local_13f0 = local_1460;
          local_1408 = local_14c8;
          uStack_1400 = uStack_14c0;
          auVar31._8_8_ = uStack_14c0;
          auVar31._0_8_ = local_14c8;
          *local_1460 = auVar31;
          local_1460 = local_1460 + 1;
          local_b58 = local_3108;
          uStack_b50 = uStack_3100;
          local_208 = local_30f8;
          uStack_200 = uStack_30f0;
          local_1f8 = local_b68;
          uStack_1f0 = uStack_b60;
        }
        for (; local_14ac < local_2bfc; local_14ac = local_14ac + 1) {
          *(float *)*local_1460 = *(float *)*local_1460 * local_147c + local_1480;
          local_1460 = (undefined1 (*) [16])(*local_1460 + 4);
        }
      }
      else {
        local_1a60 = local_2bf0;
        local_1a68 = local_2ca0;
        local_1a70 = local_2ca8;
        local_1a78 = local_2c08;
        local_1a80 = local_2c10;
        local_1a84 = local_2bf4;
        local_1a88 = local_2bfc;
        if (local_2bf4 == 4) {
          local_1a8c = 0;
          local_19b0 = local_2ca0;
          local_1aa8 = *(undefined8 *)local_2ca0;
          uStack_1aa0 = *(undefined8 *)(local_2ca0 + 2);
          local_19b8 = local_2ca8;
          local_1ab8 = *local_2ca8;
          for (; local_1a8c + 4 <= local_2bfc; local_1a8c = local_1a8c + 4) {
            local_19c0 = local_1a60;
            local_7f8 = *(undefined8 *)*local_1a60;
            uStack_7f0 = *(undefined8 *)(*local_1a60 + 8);
            local_19f8 = *local_1a78;
            local_1ad8 = CONCAT44(local_19f8,local_19f8);
            uStack_1ad0 = CONCAT44(local_19f8,local_19f8);
            local_1a18 = *local_1a80;
            local_1ae8 = CONCAT44(local_1a18,local_1a18);
            uStack_1ae0 = CONCAT44(local_1a18,local_1a18);
            local_818 = local_1ab8._0_8_;
            uStack_810 = local_1ab8._8_8_;
            local_358._0_4_ = (float)local_7f8;
            local_358._4_4_ = (float)((ulong)local_7f8 >> 0x20);
            uStack_350._0_4_ = (float)uStack_7f0;
            uStack_350._4_4_ = (float)((ulong)uStack_7f0 >> 0x20);
            local_368._0_4_ = (float)local_1aa8;
            local_368._4_4_ = (float)((ulong)local_1aa8 >> 0x20);
            uStack_360._0_4_ = (float)uStack_1aa0;
            uStack_360._4_4_ = (float)((ulong)uStack_1aa0 >> 0x20);
            local_7d8 = (float)local_358 * (float)local_368;
            fStack_7d4 = local_358._4_4_ * local_368._4_4_;
            fStack_7d0 = (float)uStack_350 * (float)uStack_360;
            fStack_7cc = uStack_350._4_4_ * uStack_360._4_4_;
            local_7e8._0_4_ = local_1ab8._0_4_;
            local_7e8._4_4_ = local_1ab8._4_4_;
            uStack_7e0._0_4_ = local_1ab8._8_4_;
            uStack_7e0._4_4_ = local_1ab8._12_4_;
            local_1ac8 = CONCAT44(fStack_7d4 + local_7e8._4_4_,local_7d8 + (float)local_7e8);
            uStack_1ac0 = CONCAT44(fStack_7cc + uStack_7e0._4_4_,fStack_7d0 + (float)uStack_7e0);
            local_848 = local_1ac8;
            uStack_840 = uStack_1ac0;
            local_338 = local_1ac8;
            uStack_330 = uStack_1ac0;
            local_828 = (local_7d8 + (float)local_7e8) * local_19f8;
            fStack_824 = (fStack_7d4 + local_7e8._4_4_) * local_19f8;
            fStack_820 = (fStack_7d0 + (float)uStack_7e0) * local_19f8;
            fStack_81c = (fStack_7cc + uStack_7e0._4_4_) * local_19f8;
            local_1ac8 = CONCAT44(fStack_824 + local_1a18,local_828 + local_1a18);
            uStack_1ac0 = CONCAT44(fStack_81c + local_1a18,fStack_820 + local_1a18);
            local_1970 = local_1a60;
            local_1988 = local_1ac8;
            uStack_1980 = uStack_1ac0;
            auVar28._8_8_ = uStack_1ac0;
            auVar28._0_8_ = local_1ac8;
            *local_1a60 = auVar28;
            local_1a60 = local_1a60 + 1;
            local_1a78 = local_1a78 + 1;
            local_1a80 = local_1a80 + 1;
            fStack_1a14 = local_1a18;
            fStack_1a10 = local_1a18;
            fStack_1a0c = local_1a18;
            local_1a08 = local_1a18;
            fStack_19f4 = local_19f8;
            fStack_19f0 = local_19f8;
            fStack_19ec = local_19f8;
            local_19dc = local_19f8;
            local_868 = local_1ae8;
            uStack_860 = uStack_1ae0;
            local_858 = local_1ad8;
            uStack_850 = uStack_1ad0;
            local_838 = local_1ae8;
            uStack_830 = uStack_1ae0;
            local_808 = local_1aa8;
            uStack_800 = uStack_1aa0;
            local_7e8 = local_1ab8._0_8_;
            uStack_7e0 = local_1ab8._8_8_;
            local_368 = local_1aa8;
            uStack_360 = uStack_1aa0;
            local_358 = local_7f8;
            uStack_350 = uStack_7f0;
            local_348 = local_1ad8;
            uStack_340 = uStack_1ad0;
          }
        }
        if (local_2bf4 == 1) {
          local_1aec = 0;
          local_1af0 = *local_2ca0;
          local_1af4 = *(float *)*local_2ca8;
          local_1b08 = CONCAT44(local_1af0,local_1af0);
          uStack_1b00 = CONCAT44(local_1af0,local_1af0);
          uVar1 = CONCAT44(local_1af4,local_1af4);
          local_1b18._8_4_ = local_1af4;
          local_1b18._0_8_ = uVar1;
          local_1b18._12_4_ = local_1af4;
          for (; local_1aec + 4 <= local_2bfc; local_1aec = local_1aec + 4) {
            local_19c8 = local_1a60;
            local_758 = *(undefined8 *)*local_1a60;
            uStack_750 = *(undefined8 *)(*local_1a60 + 8);
            local_19d0 = local_1a78;
            local_1b38 = *(undefined8 *)local_1a78;
            uStack_1b30 = *(undefined8 *)(local_1a78 + 2);
            local_19d8 = local_1a80;
            local_1b48 = *(undefined8 *)local_1a80;
            uStack_1b40 = *(undefined8 *)(local_1a80 + 2);
            uStack_770 = local_1b18._8_8_;
            local_398._0_4_ = (float)local_758;
            local_398._4_4_ = (float)((ulong)local_758 >> 0x20);
            uStack_390._0_4_ = (float)uStack_750;
            uStack_390._4_4_ = (float)((ulong)uStack_750 >> 0x20);
            local_738 = (float)local_398 * local_1af0;
            fStack_734 = local_398._4_4_ * local_1af0;
            fStack_730 = (float)uStack_390 * local_1af0;
            fStack_72c = uStack_390._4_4_ * local_1af0;
            uStack_740 = local_1b18._8_8_;
            local_1b28 = CONCAT44(fStack_734 + local_1af4,local_738 + local_1af4);
            uStack_1b20 = CONCAT44(fStack_72c + local_1af4,fStack_730 + local_1af4);
            local_7a8 = local_1b28;
            uStack_7a0 = uStack_1b20;
            local_378 = local_1b28;
            uStack_370 = uStack_1b20;
            local_388._0_4_ = (float)local_1b38;
            local_388._4_4_ = (float)((ulong)local_1b38 >> 0x20);
            uStack_380._0_4_ = (float)uStack_1b30;
            uStack_380._4_4_ = (float)((ulong)uStack_1b30 >> 0x20);
            local_788 = (local_738 + local_1af4) * (float)local_388;
            fStack_784 = (fStack_734 + local_1af4) * local_388._4_4_;
            fStack_780 = (fStack_730 + local_1af4) * (float)uStack_380;
            fStack_77c = (fStack_72c + local_1af4) * uStack_380._4_4_;
            local_798._0_4_ = (float)local_1b48;
            local_798._4_4_ = (float)((ulong)local_1b48 >> 0x20);
            uStack_790._0_4_ = (float)uStack_1b40;
            uStack_790._4_4_ = (float)((ulong)uStack_1b40 >> 0x20);
            local_1b28 = CONCAT44(fStack_784 + local_798._4_4_,local_788 + (float)local_798);
            uStack_1b20 = CONCAT44(fStack_77c + uStack_790._4_4_,fStack_780 + (float)uStack_790);
            local_1990 = local_1a60;
            local_19a8 = local_1b28;
            uStack_19a0 = uStack_1b20;
            auVar27._8_8_ = uStack_1b20;
            auVar27._0_8_ = local_1b28;
            *local_1a60 = auVar27;
            local_1a60 = local_1a60 + 1;
            local_1a78 = local_1a78 + 4;
            local_1a80 = local_1a80 + 4;
            local_7c8 = local_1b48;
            uStack_7c0 = uStack_1b40;
            local_7b8 = local_1b38;
            uStack_7b0 = uStack_1b30;
            local_798 = local_1b48;
            uStack_790 = uStack_1b40;
            local_778 = uVar1;
            local_768 = local_1b08;
            uStack_760 = uStack_1b00;
            local_748 = uVar1;
            local_3a8 = local_1b08;
            uStack_3a0 = uStack_1b00;
            local_398 = local_758;
            uStack_390 = uStack_750;
            local_388 = local_1b38;
            uStack_380 = uStack_1b30;
          }
          for (; local_1a58 = local_1af4, fStack_1a54 = local_1af4, fStack_1a50 = local_1af4,
              fStack_1a4c = local_1af4, local_1a48 = local_1af4, local_1a38 = local_1af0,
              fStack_1a34 = local_1af0, fStack_1a30 = local_1af0, fStack_1a2c = local_1af0,
              local_1a1c = local_1af0, local_1aec < local_2bfc; local_1aec = local_1aec + 1) {
            *(float *)*local_1a60 =
                 (*(float *)*local_1a60 * local_1af0 + local_1af4) * *local_1a78 + *local_1a80;
            local_1a60 = (undefined1 (*) [16])(*local_1a60 + 4);
            local_1a78 = local_1a78 + 1;
            local_1a80 = local_1a80 + 1;
          }
        }
      }
    }
  }
  if (local_2f84 == 3) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == local_2f8c) {
      for (local_2fcc = 0; local_2fcc < local_2f94; local_2fcc = local_2fcc + 1) {
        for (local_2fd0 = 0; local_2fd0 < local_2f90; local_2fd0 = local_2fd0 + 1) {
          local_2a80 = &local_3020;
          local_f4 = *(int *)((long)local_2f78 + 0x2c);
          local_f8 = (int)local_2f78[6];
          local_fc = *(undefined4 *)((long)local_2f78 + 0x34);
          local_108 = *local_2f78 + local_2f78[8] * (long)local_2fcc * local_2f78[2];
          local_110 = local_2f78[2];
          local_114 = (undefined4)local_2f78[3];
          local_120 = local_2f78[4];
          local_f0 = &local_3020;
          local_98 = (long)local_f4 * (long)local_f8 * local_110;
          local_2ac0 = &local_3020;
          local_2fd8 = (undefined1 (*) [16])
                       (local_108 + (long)local_f4 * (long)local_2fd0 * local_110);
          local_2a68 = &local_3020;
          local_9c = 0x10;
          local_2a8c = local_2fcc;
          local_2a8d = 1;
          local_2ac4 = local_2fd0;
          local_3020 = 0;
          local_3010 = 0;
          local_3008 = 0;
          local_2ff8 = 0;
          local_2ff4 = 0;
          local_2ff0 = 0;
          local_2fec = 0;
          local_2fe8 = 0;
          local_2fe0 = 0;
          local_3018 = 0;
          local_2d1c = local_2f8c * local_2f88;
          local_2d34 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
          local_2d78[0x10] = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          local_2d14 = local_2f88;
          local_2d18 = local_2f8c;
          local_2d28 = local_2fa0;
          local_2d30 = local_2fa8;
          local_2d78[0xc] = 0.0;
          local_2d78[0xd] = 0.0;
          local_2d78[0xe] = 0.0;
          local_2d78[0xf] = 0.0;
          local_2d78[8] = 0.0;
          local_2d78[9] = 0.0;
          local_2d78[10] = 0.0;
          local_2d78[0xb] = 0.0;
          local_2d78[4] = 0.0;
          local_2d78[5] = 0.0;
          local_2d78[6] = 0.0;
          local_2d78[7] = 0.0;
          local_2d78[0] = 0.0;
          local_2d78[1] = 0.0;
          local_2d78[2] = 0.0;
          local_2d78[3] = 0.0;
          local_2d88 = 0;
          uStack_2d80 = 0;
          local_2d98 = 0;
          uStack_2d90 = 0;
          local_2da8 = 0;
          uStack_2da0 = 0;
          local_2db8 = ZEXT816(0);
          local_2938 = local_2d78;
          local_293c = local_2f88;
          local_2940 = local_2f8c;
          local_2948 = 0;
          local_23b8 = 0;
          uStack_23b0 = 0;
          local_2958 = 0;
          uStack_2950 = 0;
          local_2930 = local_2fd8;
          while( true ) {
            uVar2 = uStack_2270;
            uVar1 = local_2278;
            local_2278._0_4_ = (float)local_2958;
            local_2278._4_4_ = (float)((ulong)local_2958 >> 0x20);
            uStack_2270._0_4_ = (float)uStack_2950;
            uStack_2270._4_4_ = (float)((ulong)uStack_2950 >> 0x20);
            if (local_2d1c < local_2948 + 4) break;
            local_2300 = local_2930;
            local_2968 = *(undefined8 *)*local_2930;
            uStack_2960 = *(undefined8 *)(*local_2930 + 8);
            uVar1 = local_2958;
            uVar2 = uStack_2950;
            local_2288._0_4_ = (float)local_2968;
            local_2288._4_4_ = (float)((ulong)local_2968 >> 0x20);
            uStack_2280._0_4_ = (float)uStack_2960;
            uStack_2280._4_4_ = (float)((ulong)uStack_2960 >> 0x20);
            local_2958 = CONCAT44(local_2278._4_4_ + local_2288._4_4_,
                                  (float)local_2278 + (float)local_2288);
            uStack_2950 = CONCAT44(uStack_2270._4_4_ + uStack_2280._4_4_,
                                   (float)uStack_2270 + (float)uStack_2280);
            local_2948 = local_2948 + 4;
            local_2930 = local_2930 + 1;
            local_2288 = local_2968;
            uStack_2280 = uStack_2960;
            local_2278 = uVar1;
            uStack_2270 = uVar2;
          }
          local_296c = 0.0;
          for (; local_2948 < local_2d1c; local_2948 = local_2948 + 1) {
            local_296c = *(float *)*local_2930 + local_296c;
            local_2930 = (undefined1 (*) [16])(*local_2930 + 4);
          }
          if (local_2f88 == 4) {
            local_2568 = (float)local_2f8c;
            local_20c8 = CONCAT44(local_2568,local_2568);
            uStack_20c0 = CONCAT44(local_2568,local_2568);
            local_20b8 = local_2958;
            uStack_20b0 = uStack_2950;
            auVar16._8_8_ = uStack_2950;
            auVar16._0_8_ = local_2958;
            auVar15._8_8_ = uStack_20c0;
            auVar15._0_8_ = local_20c8;
            auVar38 = divps(auVar16,auVar15);
            local_2988._0_8_ = auVar38._0_8_;
            local_2988._8_8_ = auVar38._8_8_;
            local_1e88 = local_2988._0_8_;
            uStack_1e80 = local_2988._8_8_;
            local_2d78[0] = (float)local_2988._0_4_;
            local_2d78[1] = (float)local_2988._4_4_;
            local_2d78[2] = (float)local_2988._8_4_;
            local_2d78[3] = (float)local_2988._12_4_;
            local_2988 = auVar38;
            fStack_2564 = local_2568;
            fStack_2560 = local_2568;
            fStack_255c = local_2568;
            local_2558 = local_2568;
            local_1e70 = local_2938;
          }
          if (local_2f88 == 1) {
            local_1078 = local_2958;
            uStack_1070 = uStack_2950;
            local_f58 = local_2958;
            uStack_f50 = uStack_2950;
            local_f68 = local_2958;
            uStack_f60 = uStack_2950;
            local_1058 = local_2958;
            uStack_1050 = uStack_2950;
            local_1068 = uStack_2950;
            uStack_1060 = uStack_2950;
            local_1088 = (float)local_2278 + (float)uStack_2270;
            fStack_1084 = local_2278._4_4_ + uStack_2270._4_4_;
            fStack_1080 = (float)uStack_2270 + (float)uStack_2270;
            fStack_107c = uStack_2270._4_4_ + uStack_2270._4_4_;
            local_e58 = local_1088 + fStack_1084;
            local_1098 = CONCAT44(fStack_1084,local_e58);
            uStack_1090 = CONCAT44(fStack_107c,fStack_1080);
            local_296c = local_e58 + local_296c;
            local_2d78[0] = local_296c / (float)local_2f8c;
            local_e68 = fStack_1084;
            fStack_e64 = fStack_1084;
            fStack_e60 = fStack_1084;
            fStack_e5c = fStack_1084;
            fStack_e54 = fStack_1084;
            fStack_e50 = fStack_1080;
            fStack_e4c = fStack_107c;
            local_d88 = local_1098;
            uStack_d80 = uStack_1090;
          }
          local_2728 = local_2db8;
          local_2730 = local_2d78;
          local_2734 = local_2f88;
          local_2738 = local_2f8c;
          fVar36 = local_2d78[0];
          local_2740 = local_2d78[0];
          if (local_2f88 == 4) {
            local_3158._0_4_ = local_2d78[0];
            local_3158._4_4_ = local_2d78[1];
            uStack_3150._0_4_ = local_2d78[2];
            uStack_3150._4_4_ = local_2d78[3];
            local_2338 = local_2730;
          }
          else {
            local_3158._4_4_ = local_2d78[0];
            local_3158._0_4_ = local_2d78[0];
            uStack_3150._4_4_ = local_2d78[0];
            uStack_3150._0_4_ = local_2d78[0];
            local_2628 = local_2740;
            fStack_2624 = local_2740;
            fStack_2620 = local_2740;
            fStack_261c = local_2740;
            local_2618 = local_2740;
          }
          local_2758 = local_3158;
          uStack_2750 = uStack_3150;
          local_275c = 0;
          local_23f8 = 0;
          uStack_23f0 = 0;
          local_2778 = 0;
          uStack_2770 = 0;
          local_2720 = local_2fd8;
          while( true ) {
            uVar4 = uStack_560;
            uVar3 = local_568;
            local_568._0_4_ = (float)local_2778;
            local_568._4_4_ = (float)((ulong)local_2778 >> 0x20);
            uStack_560._0_4_ = (float)uStack_2770;
            uStack_560._4_4_ = (float)((ulong)uStack_2770 >> 0x20);
            if (local_2d1c < local_275c + 4) break;
            local_2330 = local_2720;
            uVar3 = *(undefined8 *)*local_2720;
            uVar4 = *(undefined8 *)(*local_2720 + 8);
            local_c78._0_4_ = (float)uVar3;
            local_c78._4_4_ = (float)((ulong)uVar3 >> 0x20);
            uStack_c70._0_4_ = (float)uVar4;
            uStack_c70._4_4_ = (float)((ulong)uVar4 >> 0x20);
            local_c88 = (float)local_3158;
            fStack_c84 = SUB84(local_3158,4);
            fStack_c80 = (float)uStack_3150;
            fStack_c7c = SUB84(uStack_3150,4);
            local_c78._0_4_ = (float)local_c78 - local_c88;
            local_c78._4_4_ = local_c78._4_4_ - fStack_c84;
            uStack_c70._0_4_ = (float)uStack_c70 - fStack_c80;
            uStack_c70._4_4_ = uStack_c70._4_4_ - fStack_c7c;
            local_2788 = CONCAT44(local_c78._4_4_,(float)local_c78);
            uStack_2780 = CONCAT44(uStack_c70._4_4_,(float)uStack_c70);
            local_578 = local_2788;
            uStack_570 = uStack_2780;
            local_588 = local_2788;
            uStack_580 = uStack_2780;
            local_598 = local_2778;
            uStack_590 = uStack_2770;
            local_458 = local_2788;
            uStack_450 = uStack_2780;
            local_468 = local_2788;
            uStack_460 = uStack_2780;
            local_558 = (float)local_c78 * (float)local_c78;
            fStack_554 = local_c78._4_4_ * local_c78._4_4_;
            fStack_550 = (float)uStack_c70 * (float)uStack_c70;
            fStack_54c = uStack_c70._4_4_ * uStack_c70._4_4_;
            uVar5 = local_2778;
            uVar6 = uStack_2770;
            local_2778 = CONCAT44(fStack_554 + local_568._4_4_,local_558 + (float)local_568);
            uStack_2770 = CONCAT44(fStack_54c + uStack_560._4_4_,fStack_550 + (float)uStack_560);
            local_275c = local_275c + 4;
            local_2720 = local_2720 + 1;
            _local_c88 = local_3158;
            _fStack_c80 = uStack_3150;
            local_c78 = uVar3;
            uStack_c70 = uVar4;
            local_568 = uVar5;
            uStack_560 = uVar6;
          }
          local_278c = 0.0;
          for (; local_275c < local_2d1c; local_275c = local_275c + 1) {
            local_2790 = *(float *)*local_2720 - fVar36;
            local_278c = local_2790 * local_2790 + local_278c;
            local_2720 = (undefined1 (*) [16])(*local_2720 + 4);
          }
          if (local_2f88 == 4) {
            local_2648 = (float)local_2f8c;
            local_2148 = CONCAT44(local_2648,local_2648);
            uStack_2140 = CONCAT44(local_2648,local_2648);
            local_2138 = local_2778;
            uStack_2130 = uStack_2770;
            auVar10._8_8_ = uStack_2770;
            auVar10._0_8_ = local_2778;
            auVar9._8_8_ = uStack_2140;
            auVar9._0_8_ = local_2148;
            local_27a8 = divps(auVar10,auVar9);
            local_1f08 = local_27a8._0_8_;
            uStack_1f00 = local_27a8._8_8_;
            local_2db8 = local_27a8;
            fStack_2644 = local_2648;
            fStack_2640 = local_2648;
            fStack_263c = local_2648;
            local_2638 = local_2648;
            local_1ef0 = local_2728;
          }
          if (local_2f88 == 1) {
            local_11b8 = local_2778;
            uStack_11b0 = uStack_2770;
            local_ed8 = local_2778;
            uStack_ed0 = uStack_2770;
            local_ee8 = local_2778;
            uStack_ee0 = uStack_2770;
            local_1198 = local_2778;
            uStack_1190 = uStack_2770;
            local_11a8 = uStack_2770;
            uStack_11a0 = uStack_2770;
            local_11c8 = (float)local_568 + (float)uStack_560;
            fStack_11c4 = local_568._4_4_ + uStack_560._4_4_;
            fStack_11c0 = (float)uStack_560 + (float)uStack_560;
            fStack_11bc = uStack_560._4_4_ + uStack_560._4_4_;
            local_dd8 = local_11c8 + fStack_11c4;
            local_11d8 = CONCAT44(fStack_11c4,local_dd8);
            uStack_11d0 = CONCAT44(fStack_11bc,fStack_11c0);
            local_278c = local_dd8 + local_278c;
            local_2db8._0_4_ = local_278c / (float)local_2f8c;
            local_de8 = fStack_11c4;
            fStack_de4 = fStack_11c4;
            fStack_de0 = fStack_11c4;
            fStack_ddc = fStack_11c4;
            fStack_dd4 = fStack_11c4;
            fStack_dd0 = fStack_11c0;
            fStack_dcc = fStack_11bc;
            local_d48 = local_11d8;
            uStack_d40 = uStack_11d0;
          }
          local_2dc0 = (float *)local_2db8;
          local_2dc8 = (undefined1 (*) [16])local_2d78;
          if (local_2f88 == 4) {
            local_244c = 0x3f800000;
            local_2468 = 0x3f800000;
            uStack_2464 = 0x3f800000;
            uStack_2460 = 0x3f800000;
            uStack_245c = 0x3f800000;
            local_2018 = 0x3f8000003f800000;
            uStack_2010 = 0x3f8000003f800000;
            local_2de8 = CONCAT44(local_2d78[0x10],local_2d78[0x10]);
            uStack_2de0 = CONCAT44(local_2d78[0x10],local_2d78[0x10]);
            local_2368 = 0;
            uStack_2360 = 0;
            local_22c0 = local_2db8;
            uVar5 = local_2db8._0_8_;
            uVar6 = local_2db8._8_8_;
            local_21d8._0_4_ = local_2db8._0_4_;
            local_21d8._4_4_ = local_2db8._4_4_;
            uStack_21d0._0_4_ = local_2db8._8_4_;
            uStack_21d0._4_4_ = local_2db8._12_4_;
            local_2e08 = CONCAT44(local_21d8._4_4_ + local_2d78[0x10],
                                  (float)local_21d8 + local_2d78[0x10]);
            uStack_2e00 = CONCAT44(uStack_21d0._4_4_ + local_2d78[0x10],
                                   (float)uStack_21d0 + local_2d78[0x10]);
            local_2188 = local_2e08;
            uStack_2180 = uStack_2e00;
            auVar43._8_8_ = uStack_2e00;
            auVar43._0_8_ = local_2e08;
            auVar38 = rsqrtps(in_XMM3,auVar43);
            fVar35 = ((float)local_21d8 + local_2d78[0x10]) * auVar38._0_4_;
            fVar39 = (local_21d8._4_4_ + local_2d78[0x10]) * auVar38._4_4_;
            fVar40 = ((float)uStack_21d0 + local_2d78[0x10]) * auVar38._8_4_;
            fVar41 = (uStack_21d0._4_4_ + local_2d78[0x10]) * auVar38._12_4_;
            auVar43 = auVar43 & _DAT_01f1a120;
            local_2e18 = -(uint)(1.1754944e-38 <= auVar43._0_4_) &
                         (uint)(fVar35 * -0.5 * (fVar35 * auVar38._0_4_ + (float)DAT_01f1e9e0));
            uStack_2e14 = -(uint)(1.1754944e-38 <= auVar43._4_4_) &
                          (uint)(fVar39 * -0.5 * (fVar39 * auVar38._4_4_ + DAT_01f1e9e0._4_4_));
            uStack_2e10 = -(uint)(1.1754944e-38 <= auVar43._8_4_) &
                          (uint)(fVar40 * -0.5 * (fVar40 * auVar38._8_4_ + DAT_01f1e9e0._8_4_));
            uStack_2e0c = -(uint)(1.1754944e-38 <= auVar43._12_4_) &
                          (uint)(fVar41 * -0.5 * (fVar41 * auVar38._12_4_ + DAT_01f1e9e0._12_4_));
            local_2028 = CONCAT44(uStack_2e14,local_2e18);
            uStack_2020 = CONCAT44(uStack_2e0c,uStack_2e10);
            auVar22._8_8_ = 0x3f8000003f800000;
            auVar22._0_8_ = 0x3f8000003f800000;
            auVar21._8_8_ = uStack_2020;
            auVar21._0_8_ = local_2028;
            local_2dd8 = divps(auVar22,auVar21);
            local_22c8 = local_2d78;
            local_2e28._0_4_ = local_2d78[0];
            local_2e28._4_4_ = local_2d78[1];
            uStack_2e20._0_4_ = local_2d78[2];
            uStack_2e20._4_4_ = local_2d78[3];
            local_1f78 = local_2dd8._0_8_;
            uStack_1f70 = local_2dd8._8_8_;
            local_1f88 = 0;
            uStack_1f80 = 0;
            local_188 = local_2dd8._0_8_;
            uVar33 = local_188;
            uStack_180 = local_2dd8._8_8_;
            uVar34 = uStack_180;
            fStack_174 = SUB84(local_2d78._0_8_,4);
            fStack_170 = (float)local_2d78._8_8_;
            fStack_16c = SUB84(local_2d78._8_8_,4);
            local_188._0_4_ = local_2dd8._0_4_;
            local_188._4_4_ = local_2dd8._4_4_;
            uStack_180._0_4_ = local_2dd8._8_4_;
            uStack_180._4_4_ = local_2dd8._12_4_;
            local_d08 = fVar36 * (float)local_188;
            fStack_d04 = fStack_174 * local_188._4_4_;
            fStack_d00 = fStack_170 * (float)uStack_180;
            fStack_cfc = fStack_16c * uStack_180._4_4_;
            local_cf8 = 0;
            uStack_cf0 = 0;
            fStack_2df4 = 0.0 - fStack_d04;
            local_2df8 = 0.0 - local_d08;
            fStack_2dec = 0.0 - fStack_cfc;
            fStack_2df0 = 0.0 - fStack_d00;
            local_1d88 = local_2dd8._0_8_;
            uStack_1d80 = local_2dd8._8_8_;
            local_2db8 = local_2dd8;
            local_1da8 = _local_2df8;
            uStack_1da0 = _fStack_2df0;
            local_2d78[2] = 0.0 - fStack_d00;
            local_2d78[3] = 0.0 - fStack_cfc;
            local_2d78[0] = 0.0 - local_d08;
            local_2d78[1] = 0.0 - fStack_d04;
            in_XMM3 = _DAT_01f1e9e0;
            local_2488 = local_2d78[0x10];
            fStack_2484 = local_2d78[0x10];
            fStack_2480 = local_2d78[0x10];
            fStack_247c = local_2d78[0x10];
            local_246c = local_2d78[0x10];
            local_21e8 = local_2de8;
            uStack_21e0 = uStack_2de0;
            local_21d8 = uVar5;
            uStack_21d0 = uVar6;
            local_1f68 = local_2e28;
            uStack_1f60 = uStack_2e20;
            local_1d90 = local_2dc8;
            local_1d70 = local_2dc0;
            local_188 = uVar33;
            uStack_180 = uVar34;
            local_178 = local_2e28;
            _fStack_170 = uStack_2e20;
          }
          local_2d10 = local_2fd8;
          local_2278 = uVar1;
          uStack_2270 = uVar2;
          local_568 = uVar3;
          uStack_560 = uVar4;
          if (local_2f88 == 1) {
            local_2944 = local_2d1c;
            local_273c = local_2d1c;
            local_58 = local_2a68;
            local_3000 = local_120;
            dVar37 = std::sqrt((double)(ulong)(uint)((float)local_2db8._0_4_ + local_2d78[0x10]));
            *local_2dc0 = 1.0 / SUB84(dVar37,0);
            *(float *)*local_2dc8 = -local_2d78[0] * *local_2dc0;
          }
          if (local_2d34 == 0) {
            local_1380 = local_2d10;
            local_1388 = local_2dc0;
            local_1390 = local_2dc8;
            local_1394 = local_2d14;
            local_1398 = local_2d1c;
            local_139c = *local_2dc0;
            local_13a0 = *(float *)*local_2dc8;
            if (local_2d14 == 4) {
              local_1330 = local_2dc0;
              local_3168 = *(undefined8 *)local_2dc0;
              uStack_3160 = *(undefined8 *)(local_2dc0 + 2);
            }
            else {
              local_3168 = CONCAT44(local_139c,local_139c);
              uStack_3160 = CONCAT44(local_139c,local_139c);
              local_1358 = local_139c;
              fStack_1354 = local_139c;
              fStack_1350 = local_139c;
              fStack_134c = local_139c;
              local_1348 = local_139c;
            }
            local_13b8 = local_3168;
            uStack_13b0 = uStack_3160;
            if (local_2d14 == 4) {
              local_1338 = local_2dc8;
              local_3178 = *(undefined8 *)*local_2dc8;
              uStack_3170 = *(undefined8 *)(*local_2dc8 + 8);
            }
            else {
              local_3178 = CONCAT44(local_13a0,local_13a0);
              uStack_3170 = CONCAT44(local_13a0,local_13a0);
              local_1378 = local_13a0;
              fStack_1374 = local_13a0;
              fStack_1370 = local_13a0;
              fStack_136c = local_13a0;
              local_1368 = local_13a0;
            }
            local_13c8._8_8_ = uStack_3170;
            local_13c8._0_8_ = local_3178;
            for (local_13cc = 0; local_13cc + 4 <= local_2d1c; local_13cc = local_13cc + 4) {
              pauStack_1340 = local_1380;
              local_bb8 = *(undefined8 *)*local_1380;
              uStack_bb0 = *(undefined8 *)(*local_1380 + 8);
              local_bc8 = local_3168;
              uStack_bc0 = uStack_3160;
              local_bd8 = local_3178;
              uStack_bd0 = uStack_3170;
              local_1d8._0_4_ = (float)local_bb8;
              local_1d8._4_4_ = (float)((ulong)local_bb8 >> 0x20);
              uStack_1d0._0_4_ = (float)uStack_bb0;
              uStack_1d0._4_4_ = (float)((ulong)uStack_bb0 >> 0x20);
              local_1e8._0_4_ = (float)local_3168;
              local_1e8._4_4_ = (float)((ulong)local_3168 >> 0x20);
              uStack_1e0._0_4_ = (float)uStack_3160;
              uStack_1e0._4_4_ = (float)((ulong)uStack_3160 >> 0x20);
              local_b98 = (float)local_1d8 * (float)local_1e8;
              fStack_b94 = local_1d8._4_4_ * local_1e8._4_4_;
              fStack_b90 = (float)uStack_1d0 * (float)uStack_1e0;
              fStack_b8c = uStack_1d0._4_4_ * uStack_1e0._4_4_;
              local_ba8._0_4_ = (float)local_3178;
              local_ba8._4_4_ = (float)((ulong)local_3178 >> 0x20);
              uStack_ba0._0_4_ = (float)uStack_3170;
              uStack_ba0._4_4_ = (float)((ulong)uStack_3170 >> 0x20);
              local_13e8 = CONCAT44(fStack_b94 + local_ba8._4_4_,local_b98 + (float)local_ba8);
              uStack_13e0 = CONCAT44(fStack_b8c + uStack_ba0._4_4_,fStack_b90 + (float)uStack_ba0);
              local_1310 = local_1380;
              local_1328 = local_13e8;
              uStack_1320 = uStack_13e0;
              auVar32._8_8_ = uStack_13e0;
              auVar32._0_8_ = local_13e8;
              *local_1380 = auVar32;
              local_1380 = local_1380 + 1;
              local_ba8 = local_3178;
              uStack_ba0 = uStack_3170;
              local_1e8 = local_3168;
              uStack_1e0 = uStack_3160;
              local_1d8 = local_bb8;
              uStack_1d0 = uStack_bb0;
            }
            for (; local_13cc < local_2d1c; local_13cc = local_13cc + 1) {
              *(float *)*local_1380 = *(float *)*local_1380 * local_139c + local_13a0;
              local_1380 = (undefined1 (*) [16])(*local_1380 + 4);
            }
          }
          else {
            local_1880 = local_2d10;
            local_1888 = local_2dc0;
            local_1890 = local_2dc8;
            local_1898 = local_2d28;
            local_18a0 = local_2d30;
            local_18a4 = local_2d14;
            local_18a8 = local_2d1c;
            if (local_2d14 == 4) {
              local_18ac = 0;
              local_17d0 = local_2dc0;
              local_18c8 = *(undefined8 *)local_2dc0;
              uStack_18c0 = *(undefined8 *)(local_2dc0 + 2);
              local_17d8 = local_2dc8;
              local_18d8 = *local_2dc8;
              for (; local_18ac + 4 <= local_2d1c; local_18ac = local_18ac + 4) {
                local_17e0 = local_1880;
                local_938 = *(undefined8 *)*local_1880;
                uStack_930 = *(undefined8 *)(*local_1880 + 8);
                local_1818 = *local_1898;
                local_18f8 = CONCAT44(local_1818,local_1818);
                uStack_18f0 = CONCAT44(local_1818,local_1818);
                local_1838 = *local_18a0;
                local_1908 = CONCAT44(local_1838,local_1838);
                uStack_1900 = CONCAT44(local_1838,local_1838);
                local_958 = local_18d8._0_8_;
                uStack_950 = local_18d8._8_8_;
                local_2d8._0_4_ = (float)local_938;
                local_2d8._4_4_ = (float)((ulong)local_938 >> 0x20);
                uStack_2d0._0_4_ = (float)uStack_930;
                uStack_2d0._4_4_ = (float)((ulong)uStack_930 >> 0x20);
                local_2e8._0_4_ = (float)local_18c8;
                local_2e8._4_4_ = (float)((ulong)local_18c8 >> 0x20);
                uStack_2e0._0_4_ = (float)uStack_18c0;
                uStack_2e0._4_4_ = (float)((ulong)uStack_18c0 >> 0x20);
                local_918 = (float)local_2d8 * (float)local_2e8;
                fStack_914 = local_2d8._4_4_ * local_2e8._4_4_;
                fStack_910 = (float)uStack_2d0 * (float)uStack_2e0;
                fStack_90c = uStack_2d0._4_4_ * uStack_2e0._4_4_;
                local_928._0_4_ = local_18d8._0_4_;
                local_928._4_4_ = local_18d8._4_4_;
                uStack_920._0_4_ = local_18d8._8_4_;
                uStack_920._4_4_ = local_18d8._12_4_;
                local_18e8 = CONCAT44(fStack_914 + local_928._4_4_,local_918 + (float)local_928);
                uStack_18e0 = CONCAT44(fStack_90c + uStack_920._4_4_,fStack_910 + (float)uStack_920)
                ;
                local_988 = local_18e8;
                uStack_980 = uStack_18e0;
                local_2b8 = local_18e8;
                uStack_2b0 = uStack_18e0;
                local_968 = (local_918 + (float)local_928) * local_1818;
                fStack_964 = (fStack_914 + local_928._4_4_) * local_1818;
                fStack_960 = (fStack_910 + (float)uStack_920) * local_1818;
                fStack_95c = (fStack_90c + uStack_920._4_4_) * local_1818;
                local_18e8 = CONCAT44(fStack_964 + local_1838,local_968 + local_1838);
                uStack_18e0 = CONCAT44(fStack_95c + local_1838,fStack_960 + local_1838);
                local_1790 = local_1880;
                local_17a8 = local_18e8;
                uStack_17a0 = uStack_18e0;
                auVar30._8_8_ = uStack_18e0;
                auVar30._0_8_ = local_18e8;
                *local_1880 = auVar30;
                local_1880 = local_1880 + 1;
                local_1898 = local_1898 + 1;
                local_18a0 = local_18a0 + 1;
                fStack_1834 = local_1838;
                fStack_1830 = local_1838;
                fStack_182c = local_1838;
                local_1828 = local_1838;
                fStack_1814 = local_1818;
                fStack_1810 = local_1818;
                fStack_180c = local_1818;
                local_17fc = local_1818;
                local_9a8 = local_1908;
                uStack_9a0 = uStack_1900;
                local_998 = local_18f8;
                uStack_990 = uStack_18f0;
                local_978 = local_1908;
                uStack_970 = uStack_1900;
                local_948 = local_18c8;
                uStack_940 = uStack_18c0;
                local_928 = local_18d8._0_8_;
                uStack_920 = local_18d8._8_8_;
                local_2e8 = local_18c8;
                uStack_2e0 = uStack_18c0;
                local_2d8 = local_938;
                uStack_2d0 = uStack_930;
                local_2c8 = local_18f8;
                uStack_2c0 = uStack_18f0;
              }
            }
            if (local_2d14 == 1) {
              local_190c = 0;
              local_1910 = *local_2dc0;
              local_1914 = *(float *)*local_2dc8;
              local_1928 = CONCAT44(local_1910,local_1910);
              uStack_1920 = CONCAT44(local_1910,local_1910);
              uVar1 = CONCAT44(local_1914,local_1914);
              local_1938._8_4_ = local_1914;
              local_1938._0_8_ = uVar1;
              local_1938._12_4_ = local_1914;
              for (; local_190c + 4 <= local_2d1c; local_190c = local_190c + 4) {
                local_17e8 = local_1880;
                local_898 = *(undefined8 *)*local_1880;
                uStack_890 = *(undefined8 *)(*local_1880 + 8);
                local_17f0 = local_1898;
                local_1958 = *(undefined8 *)local_1898;
                uStack_1950 = *(undefined8 *)(local_1898 + 2);
                local_17f8 = local_18a0;
                local_1968 = *(undefined8 *)local_18a0;
                uStack_1960 = *(undefined8 *)(local_18a0 + 2);
                uStack_8b0 = local_1938._8_8_;
                local_318._0_4_ = (float)local_898;
                local_318._4_4_ = (float)((ulong)local_898 >> 0x20);
                uStack_310._0_4_ = (float)uStack_890;
                uStack_310._4_4_ = (float)((ulong)uStack_890 >> 0x20);
                local_878 = (float)local_318 * local_1910;
                fStack_874 = local_318._4_4_ * local_1910;
                fStack_870 = (float)uStack_310 * local_1910;
                fStack_86c = uStack_310._4_4_ * local_1910;
                uStack_880 = local_1938._8_8_;
                local_1948 = CONCAT44(fStack_874 + local_1914,local_878 + local_1914);
                uStack_1940 = CONCAT44(fStack_86c + local_1914,fStack_870 + local_1914);
                local_8e8 = local_1948;
                uStack_8e0 = uStack_1940;
                local_2f8 = local_1948;
                uStack_2f0 = uStack_1940;
                local_308._0_4_ = (float)local_1958;
                local_308._4_4_ = (float)((ulong)local_1958 >> 0x20);
                uStack_300._0_4_ = (float)uStack_1950;
                uStack_300._4_4_ = (float)((ulong)uStack_1950 >> 0x20);
                local_8c8 = (local_878 + local_1914) * (float)local_308;
                fStack_8c4 = (fStack_874 + local_1914) * local_308._4_4_;
                fStack_8c0 = (fStack_870 + local_1914) * (float)uStack_300;
                fStack_8bc = (fStack_86c + local_1914) * uStack_300._4_4_;
                local_8d8._0_4_ = (float)local_1968;
                local_8d8._4_4_ = (float)((ulong)local_1968 >> 0x20);
                uStack_8d0._0_4_ = (float)uStack_1960;
                uStack_8d0._4_4_ = (float)((ulong)uStack_1960 >> 0x20);
                local_1948 = CONCAT44(fStack_8c4 + local_8d8._4_4_,local_8c8 + (float)local_8d8);
                uStack_1940 = CONCAT44(fStack_8bc + uStack_8d0._4_4_,fStack_8c0 + (float)uStack_8d0)
                ;
                local_17b0 = local_1880;
                local_17c8 = local_1948;
                uStack_17c0 = uStack_1940;
                auVar29._8_8_ = uStack_1940;
                auVar29._0_8_ = local_1948;
                *local_1880 = auVar29;
                local_1880 = local_1880 + 1;
                local_1898 = local_1898 + 4;
                local_18a0 = local_18a0 + 4;
                local_908 = local_1968;
                uStack_900 = uStack_1960;
                local_8f8 = local_1958;
                uStack_8f0 = uStack_1950;
                local_8d8 = local_1968;
                uStack_8d0 = uStack_1960;
                local_8b8 = uVar1;
                local_8a8 = local_1928;
                uStack_8a0 = uStack_1920;
                local_888 = uVar1;
                local_328 = local_1928;
                uStack_320 = uStack_1920;
                local_318 = local_898;
                uStack_310 = uStack_890;
                local_308 = local_1958;
                uStack_300 = uStack_1950;
              }
              for (; local_1878 = local_1914, fStack_1874 = local_1914, fStack_1870 = local_1914,
                  fStack_186c = local_1914, local_1868 = local_1914, local_1858 = local_1910,
                  fStack_1854 = local_1910, fStack_1850 = local_1910, fStack_184c = local_1910,
                  local_183c = local_1910, local_190c < local_2d1c; local_190c = local_190c + 1) {
                *(float *)*local_1880 =
                     (*(float *)*local_1880 * local_1910 + local_1914) * *local_1898 + *local_18a0;
                local_1880 = (undefined1 (*) [16])(*local_1880 + 4);
                local_1898 = local_1898 + 1;
                local_18a0 = local_18a0 + 1;
              }
            }
          }
        }
      }
    }
    else {
      for (local_3030 = 0; local_3030 < local_2f94; local_3030 = local_3030 + 1) {
        local_2a98 = &local_3080;
        local_bc = *(int *)((long)local_2f78 + 0x2c);
        local_c0 = (int)local_2f78[6];
        local_c4 = *(undefined4 *)((long)local_2f78 + 0x34);
        local_3038 = (float *)(*local_2f78 + local_2f78[8] * (long)local_3030 * local_2f78[2]);
        local_d8 = local_2f78[2];
        local_dc = (undefined4)local_2f78[3];
        local_e8 = local_2f78[4];
        local_b8 = &local_3080;
        local_a8 = (long)local_bc * (long)local_c0 * local_d8;
        local_2f58 = &local_3080;
        local_2a58 = &local_3080;
        local_ac = 0x10;
        local_2aa4 = local_3030;
        local_2aa5 = 1;
        local_3080 = 0;
        local_3070 = 0;
        local_3068 = 0;
        local_3058 = 0;
        local_3054 = 0;
        local_3050 = 0;
        local_304c = 0;
        local_3048 = 0;
        local_3040 = 0;
        local_3078 = 0;
        local_2e38 = local_2f8c * local_2f90;
        local_2e3c = local_2e38 * local_2f88;
        local_2e54 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
        local_2e58 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        local_2e34 = local_2f88;
        local_2e48 = local_2fa0;
        local_2e50 = local_2fa8;
        local_2e68 = 0;
        uStack_2e60 = 0;
        local_2e78 = 0;
        uStack_2e70 = 0;
        local_2e88 = 0;
        uStack_2e80 = 0;
        local_2e98 = 0;
        uStack_2e90 = 0;
        local_2ea8 = 0;
        uStack_2ea0 = 0;
        local_2eb8 = 0;
        uStack_2eb0 = 0;
        local_2ec8 = 0;
        uStack_2ec0 = 0;
        local_2ed8 = 0;
        uStack_2ed0 = 0;
        local_28d8 = &local_2e98;
        local_28dc = local_2f88;
        local_28e8 = 0;
        local_23c8 = 0;
        uStack_23c0 = 0;
        local_28f8 = 0;
        uStack_28f0 = 0;
        local_28d0 = local_3038;
        while( true ) {
          uVar2 = uStack_2290;
          uVar1 = local_2298;
          local_2298._0_4_ = (float)local_28f8;
          local_2298._4_4_ = (float)((ulong)local_28f8 >> 0x20);
          uStack_2290._0_4_ = (float)uStack_28f0;
          uStack_2290._4_4_ = (float)((ulong)uStack_28f0 >> 0x20);
          if (local_2e3c < local_28e8 + 4) break;
          local_2308 = local_28d0;
          local_2908 = *(undefined8 *)local_28d0;
          uStack_2900 = *(undefined8 *)(local_28d0 + 2);
          uVar1 = local_28f8;
          uVar2 = uStack_28f0;
          local_22a8._0_4_ = (float)local_2908;
          local_22a8._4_4_ = (float)((ulong)local_2908 >> 0x20);
          uStack_22a0._0_4_ = (float)uStack_2900;
          uStack_22a0._4_4_ = (float)((ulong)uStack_2900 >> 0x20);
          local_28f8 = CONCAT44(local_2298._4_4_ + local_22a8._4_4_,
                                (float)local_2298 + (float)local_22a8);
          uStack_28f0 = CONCAT44(uStack_2290._4_4_ + uStack_22a0._4_4_,
                                 (float)uStack_2290 + (float)uStack_22a0);
          local_28e8 = local_28e8 + 4;
          local_28d0 = local_28d0 + 4;
          local_22a8 = local_2908;
          uStack_22a0 = uStack_2900;
          local_2298 = uVar1;
          uStack_2290 = uVar2;
        }
        local_290c = 0.0;
        for (; local_28e8 < local_2e3c; local_28e8 = local_28e8 + 1) {
          local_290c = *local_28d0 + local_290c;
          local_28d0 = local_28d0 + 1;
        }
        if (local_2f88 == 4) {
          local_2588 = (float)local_2e38;
          local_20e8 = CONCAT44(local_2588,local_2588);
          uStack_20e0 = CONCAT44(local_2588,local_2588);
          local_20d8 = local_28f8;
          uStack_20d0 = uStack_28f0;
          auVar14._8_8_ = uStack_28f0;
          auVar14._0_8_ = local_28f8;
          auVar13._8_8_ = uStack_20e0;
          auVar13._0_8_ = local_20e8;
          local_2928 = divps(auVar14,auVar13);
          local_1ea8 = local_2928._0_8_;
          uStack_1ea0 = local_2928._8_8_;
          local_2e98 = local_2928._0_8_;
          uStack_2e90 = local_2928._8_8_;
          fStack_2584 = local_2588;
          fStack_2580 = local_2588;
          fStack_257c = local_2588;
          local_2578 = local_2588;
          local_1e90 = local_28d8;
        }
        if (local_2f88 == 1) {
          local_10c8 = local_28f8;
          uStack_10c0 = uStack_28f0;
          local_f38 = local_28f8;
          uStack_f30 = uStack_28f0;
          local_f48 = local_28f8;
          uStack_f40 = uStack_28f0;
          local_10a8 = local_28f8;
          uStack_10a0 = uStack_28f0;
          local_10b8 = uStack_28f0;
          uStack_10b0 = uStack_28f0;
          local_10d8 = (float)local_2298 + (float)uStack_2290;
          fStack_10d4 = local_2298._4_4_ + uStack_2290._4_4_;
          fStack_10d0 = (float)uStack_2290 + (float)uStack_2290;
          fStack_10cc = uStack_2290._4_4_ + uStack_2290._4_4_;
          local_e38 = local_10d8 + fStack_10d4;
          local_10e8 = CONCAT44(fStack_10d4,local_e38);
          uStack_10e0 = CONCAT44(fStack_10cc,fStack_10d0);
          local_290c = local_e38 + local_290c;
          local_2e98._0_4_ = local_290c / (float)local_2e38;
          local_e48 = fStack_10d4;
          fStack_e44 = fStack_10d4;
          fStack_e40 = fStack_10d4;
          fStack_e3c = fStack_10d4;
          fStack_e34 = fStack_10d4;
          fStack_e30 = fStack_10d0;
          fStack_e2c = fStack_10cc;
          local_d78 = local_10e8;
          uStack_d70 = uStack_10e0;
        }
        local_2698 = &local_2ed8;
        local_26a0 = &local_2e98;
        local_26a4 = local_2f88;
        local_26b0 = (float)local_2e98;
        if (local_2f88 == 4) {
          local_31c8 = local_2e98;
          uStack_31c0 = uStack_2e90;
          local_2348 = local_26a0;
        }
        else {
          local_31c8 = CONCAT44((float)local_2e98,(float)local_2e98);
          uStack_31c0 = CONCAT44((float)local_2e98,(float)local_2e98);
          local_2668 = local_26b0;
          fStack_2664 = local_26b0;
          fStack_2660 = local_26b0;
          fStack_265c = local_26b0;
          local_2658 = local_26b0;
        }
        local_26c8 = local_31c8;
        uStack_26c0 = uStack_31c0;
        local_26cc = 0;
        local_2408 = 0;
        uStack_2400 = 0;
        local_26e8 = 0;
        uStack_26e0 = 0;
        local_2690 = local_3038;
        while( true ) {
          uVar4 = uStack_5b0;
          uVar3 = local_5b8;
          local_5b8._0_4_ = (float)local_26e8;
          local_5b8._4_4_ = (float)((ulong)local_26e8 >> 0x20);
          uStack_5b0._0_4_ = (float)uStack_26e0;
          uStack_5b0._4_4_ = (float)((ulong)uStack_26e0 >> 0x20);
          if (local_2e3c < local_26cc + 4) break;
          local_2340 = local_2690;
          uVar3 = *(undefined8 *)local_2690;
          uVar4 = *(undefined8 *)(local_2690 + 2);
          local_c98._0_4_ = (float)uVar3;
          local_c98._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_c90._0_4_ = (float)uVar4;
          uStack_c90._4_4_ = (float)((ulong)uVar4 >> 0x20);
          local_ca8._0_4_ = (float)local_31c8;
          local_ca8._4_4_ = (float)((ulong)local_31c8 >> 0x20);
          uStack_ca0._0_4_ = (float)uStack_31c0;
          uStack_ca0._4_4_ = (float)((ulong)uStack_31c0 >> 0x20);
          local_c98._0_4_ = (float)local_c98 - (float)local_ca8;
          local_c98._4_4_ = local_c98._4_4_ - local_ca8._4_4_;
          uStack_c90._0_4_ = (float)uStack_c90 - (float)uStack_ca0;
          uStack_c90._4_4_ = uStack_c90._4_4_ - uStack_ca0._4_4_;
          local_26f8 = CONCAT44(local_c98._4_4_,(float)local_c98);
          uStack_26f0 = CONCAT44(uStack_c90._4_4_,(float)uStack_c90);
          local_5c8 = local_26f8;
          uStack_5c0 = uStack_26f0;
          local_5d8 = local_26f8;
          uStack_5d0 = uStack_26f0;
          local_5e8 = local_26e8;
          uStack_5e0 = uStack_26e0;
          local_438 = local_26f8;
          uStack_430 = uStack_26f0;
          local_448 = local_26f8;
          uStack_440 = uStack_26f0;
          local_5a8 = (float)local_c98 * (float)local_c98;
          fStack_5a4 = local_c98._4_4_ * local_c98._4_4_;
          fStack_5a0 = (float)uStack_c90 * (float)uStack_c90;
          fStack_59c = uStack_c90._4_4_ * uStack_c90._4_4_;
          uVar5 = local_26e8;
          uVar6 = uStack_26e0;
          local_26e8 = CONCAT44(fStack_5a4 + local_5b8._4_4_,local_5a8 + (float)local_5b8);
          uStack_26e0 = CONCAT44(fStack_59c + uStack_5b0._4_4_,fStack_5a0 + (float)uStack_5b0);
          local_26cc = local_26cc + 4;
          local_2690 = local_2690 + 4;
          local_ca8 = local_31c8;
          uStack_ca0 = uStack_31c0;
          local_c98 = uVar3;
          uStack_c90 = uVar4;
          local_5b8 = uVar5;
          uStack_5b0 = uVar6;
        }
        local_26fc = 0.0;
        for (; local_26cc < local_2e3c; local_26cc = local_26cc + 1) {
          local_2700 = *local_2690 - (float)local_2e98;
          local_26fc = local_2700 * local_2700 + local_26fc;
          local_2690 = local_2690 + 1;
        }
        if (local_2f88 == 4) {
          local_2688 = (float)local_2e38;
          local_2168 = CONCAT44(local_2688,local_2688);
          uStack_2160 = CONCAT44(local_2688,local_2688);
          local_2158 = local_26e8;
          uStack_2150 = uStack_26e0;
          auVar8._8_8_ = uStack_26e0;
          auVar8._0_8_ = local_26e8;
          auVar7._8_8_ = uStack_2160;
          auVar7._0_8_ = local_2168;
          local_2718 = divps(auVar8,auVar7);
          local_1f28 = local_2718._0_8_;
          uStack_1f20 = local_2718._8_8_;
          local_2ed8 = local_2718._0_8_;
          uStack_2ed0 = local_2718._8_8_;
          fStack_2684 = local_2688;
          fStack_2680 = local_2688;
          fStack_267c = local_2688;
          local_2678 = local_2688;
          local_1f10 = local_2698;
        }
        if (local_2f88 == 1) {
          local_1208 = local_26e8;
          uStack_1200 = uStack_26e0;
          local_eb8 = local_26e8;
          uStack_eb0 = uStack_26e0;
          local_ec8 = local_26e8;
          uStack_ec0 = uStack_26e0;
          local_11e8 = local_26e8;
          uStack_11e0 = uStack_26e0;
          local_11f8 = uStack_26e0;
          uStack_11f0 = uStack_26e0;
          local_1218 = (float)local_5b8 + (float)uStack_5b0;
          fStack_1214 = local_5b8._4_4_ + uStack_5b0._4_4_;
          fStack_1210 = (float)uStack_5b0 + (float)uStack_5b0;
          fStack_120c = uStack_5b0._4_4_ + uStack_5b0._4_4_;
          local_db8 = local_1218 + fStack_1214;
          local_1228 = CONCAT44(fStack_1214,local_db8);
          uStack_1220 = CONCAT44(fStack_120c,fStack_1210);
          local_26fc = local_db8 + local_26fc;
          local_2ed8._0_4_ = local_26fc / (float)local_2e38;
          local_dc8 = fStack_1214;
          fStack_dc4 = fStack_1214;
          fStack_dc0 = fStack_1214;
          fStack_dbc = fStack_1214;
          fStack_db4 = fStack_1214;
          fStack_db0 = fStack_1210;
          fStack_dac = fStack_120c;
          local_d38 = local_1228;
          uStack_d30 = uStack_1220;
        }
        local_2ee0 = (float *)&local_2ed8;
        local_2ee8 = (float *)&local_2e98;
        if (local_2f88 == 4) {
          local_240c = 0x3f800000;
          local_2428 = 0x3f800000;
          uStack_2424 = 0x3f800000;
          uStack_2420 = 0x3f800000;
          uStack_241c = 0x3f800000;
          local_1ff8 = 0x3f8000003f800000;
          uStack_1ff0 = 0x3f8000003f800000;
          local_2f08 = CONCAT44(local_2e58,local_2e58);
          uStack_2f00 = CONCAT44(local_2e58,local_2e58);
          local_2358 = 0;
          uStack_2350 = 0;
          local_22b0 = &local_2ed8;
          uVar5 = local_2ed8;
          uVar6 = uStack_2ed0;
          local_21b8._0_4_ = (float)local_2ed8;
          local_21b8._4_4_ = (float)((ulong)local_2ed8 >> 0x20);
          uStack_21b0._0_4_ = (float)uStack_2ed0;
          uStack_21b0._4_4_ = (float)((ulong)uStack_2ed0 >> 0x20);
          local_2f28 = CONCAT44(local_21b8._4_4_ + local_2e58,(float)local_21b8 + local_2e58);
          uStack_2f20 = CONCAT44(uStack_21b0._4_4_ + local_2e58,(float)uStack_21b0 + local_2e58);
          local_2178 = local_2f28;
          uStack_2170 = uStack_2f20;
          auVar44._8_8_ = uStack_2f20;
          auVar44._0_8_ = local_2f28;
          auVar38 = rsqrtps(in_XMM3,auVar44);
          fVar36 = ((float)local_21b8 + local_2e58) * auVar38._0_4_;
          fVar35 = (local_21b8._4_4_ + local_2e58) * auVar38._4_4_;
          fVar39 = ((float)uStack_21b0 + local_2e58) * auVar38._8_4_;
          fVar40 = (uStack_21b0._4_4_ + local_2e58) * auVar38._12_4_;
          auVar44 = auVar44 & _DAT_01f1a120;
          local_2f38 = -(uint)(1.1754944e-38 <= auVar44._0_4_) &
                       (uint)(fVar36 * -0.5 * (fVar36 * auVar38._0_4_ + (float)DAT_01f1e9e0));
          uStack_2f34 = -(uint)(1.1754944e-38 <= auVar44._4_4_) &
                        (uint)(fVar35 * -0.5 * (fVar35 * auVar38._4_4_ + DAT_01f1e9e0._4_4_));
          uStack_2f30 = -(uint)(1.1754944e-38 <= auVar44._8_4_) &
                        (uint)(fVar39 * -0.5 * (fVar39 * auVar38._8_4_ + DAT_01f1e9e0._8_4_));
          uStack_2f2c = -(uint)(1.1754944e-38 <= auVar44._12_4_) &
                        (uint)(fVar40 * -0.5 * (fVar40 * auVar38._12_4_ + DAT_01f1e9e0._12_4_));
          local_2008 = CONCAT44(uStack_2f34,local_2f38);
          uStack_2000 = CONCAT44(uStack_2f2c,uStack_2f30);
          auVar24._8_8_ = 0x3f8000003f800000;
          auVar24._0_8_ = 0x3f8000003f800000;
          auVar23._8_8_ = uStack_2000;
          auVar23._0_8_ = local_2008;
          local_2ef8 = divps(auVar24,auVar23);
          local_22b8 = &local_2e98;
          local_2f48 = local_2e98;
          uStack_2f40 = uStack_2e90;
          local_1f48 = local_2ef8._0_8_;
          uStack_1f40 = local_2ef8._8_8_;
          local_1f58 = 0;
          uStack_1f50 = 0;
          local_1a8 = local_2ef8._0_8_;
          uVar33 = local_1a8;
          uStack_1a0 = local_2ef8._8_8_;
          uVar34 = uStack_1a0;
          local_198._4_4_ = (float)((ulong)local_2e98 >> 0x20);
          uStack_190._0_4_ = (float)uStack_2e90;
          uStack_190._4_4_ = (float)((ulong)uStack_2e90 >> 0x20);
          local_1a8._0_4_ = local_2ef8._0_4_;
          local_1a8._4_4_ = local_2ef8._4_4_;
          uStack_1a0._0_4_ = local_2ef8._8_4_;
          uStack_1a0._4_4_ = local_2ef8._12_4_;
          local_d28 = (float)local_2e98 * (float)local_1a8;
          fStack_d24 = local_198._4_4_ * local_1a8._4_4_;
          fStack_d20 = (float)uStack_190 * (float)uStack_1a0;
          fStack_d1c = uStack_190._4_4_ * uStack_1a0._4_4_;
          local_d18 = 0;
          uStack_d10 = 0;
          local_2f18 = CONCAT44(0.0 - fStack_d24,0.0 - local_d28);
          uStack_2f10 = CONCAT44(0.0 - fStack_d1c,0.0 - fStack_d20);
          local_1d48 = local_2ef8._0_8_;
          uStack_1d40 = local_2ef8._8_8_;
          local_2ed8 = local_2ef8._0_8_;
          uStack_2ed0 = local_2ef8._8_8_;
          local_1d68 = local_2f18;
          uStack_1d60 = uStack_2f10;
          local_2e98 = local_2f18;
          uStack_2e90 = uStack_2f10;
          in_XMM3 = _DAT_01f1e9e0;
          local_2448 = local_2e58;
          fStack_2444 = local_2e58;
          fStack_2440 = local_2e58;
          fStack_243c = local_2e58;
          local_242c = local_2e58;
          local_21c8 = local_2f08;
          uStack_21c0 = uStack_2f00;
          local_21b8 = uVar5;
          uStack_21b0 = uVar6;
          local_1f38 = local_2f48;
          uStack_1f30 = uStack_2f40;
          local_1d50 = local_2ee8;
          local_1d30 = local_2ee0;
          local_1a8 = uVar33;
          uStack_1a0 = uVar34;
          local_198 = local_2f48;
          uStack_190 = uStack_2f40;
        }
        local_2e30 = local_3038;
        local_2298 = uVar1;
        uStack_2290 = uVar2;
        local_5b8 = uVar3;
        uStack_5b0 = uVar4;
        if (local_2f88 == 1) {
          local_28e4 = local_2e3c;
          local_28e0 = local_2e38;
          local_26ac = local_2e3c;
          local_26a8 = local_2e38;
          local_d0 = local_3038;
          local_78 = local_2a58;
          local_3060 = local_e8;
          dVar37 = std::sqrt((double)(ulong)(uint)((float)local_2ed8 + local_2e58));
          *local_2ee0 = 1.0 / SUB84(dVar37,0);
          *local_2ee8 = -(float)local_2e98 * *local_2ee0;
        }
        if (local_2e54 == 0) {
          local_12a0 = local_2e30;
          local_12a8 = local_2ee0;
          local_12b0 = local_2ee8;
          local_12b4 = local_2e34;
          local_12b8 = local_2e3c;
          local_12bc = *local_2ee0;
          local_12c0 = *local_2ee8;
          if (local_2e34 == 4) {
            local_1250 = local_2ee0;
            local_31d8 = *(undefined8 *)local_2ee0;
            uStack_31d0 = *(undefined8 *)(local_2ee0 + 2);
          }
          else {
            local_31d8 = CONCAT44(local_12bc,local_12bc);
            uStack_31d0 = CONCAT44(local_12bc,local_12bc);
            local_1278 = local_12bc;
            fStack_1274 = local_12bc;
            fStack_1270 = local_12bc;
            fStack_126c = local_12bc;
            local_1268 = local_12bc;
          }
          local_12d8 = local_31d8;
          uStack_12d0 = uStack_31d0;
          if (local_2e34 == 4) {
            local_1258 = local_2ee8;
            local_31e8 = *(undefined8 *)local_2ee8;
            uStack_31e0 = *(undefined8 *)(local_2ee8 + 2);
          }
          else {
            local_31e8 = CONCAT44(local_12c0,local_12c0);
            uStack_31e0 = CONCAT44(local_12c0,local_12c0);
            local_1298 = local_12c0;
            fStack_1294 = local_12c0;
            fStack_1290 = local_12c0;
            fStack_128c = local_12c0;
            local_1288 = local_12c0;
          }
          local_12e8 = local_31e8;
          uStack_12e0 = uStack_31e0;
          for (local_12ec = 0; local_12ec + 4 <= local_2e3c; local_12ec = local_12ec + 4) {
            pfStack_1260 = local_12a0;
            local_c08 = *(undefined8 *)local_12a0;
            uStack_c00 = *(undefined8 *)(local_12a0 + 2);
            local_c18 = local_31d8;
            uStack_c10 = uStack_31d0;
            local_c28 = local_31e8;
            uStack_c20 = uStack_31e0;
            local_1b8._0_4_ = (float)local_c08;
            local_1b8._4_4_ = (float)((ulong)local_c08 >> 0x20);
            uStack_1b0._0_4_ = (float)uStack_c00;
            uStack_1b0._4_4_ = (float)((ulong)uStack_c00 >> 0x20);
            local_1c8._0_4_ = (float)local_31d8;
            local_1c8._4_4_ = (float)((ulong)local_31d8 >> 0x20);
            uStack_1c0._0_4_ = (float)uStack_31d0;
            uStack_1c0._4_4_ = (float)((ulong)uStack_31d0 >> 0x20);
            local_be8 = (float)local_1b8 * (float)local_1c8;
            fStack_be4 = local_1b8._4_4_ * local_1c8._4_4_;
            fStack_be0 = (float)uStack_1b0 * (float)uStack_1c0;
            fStack_bdc = uStack_1b0._4_4_ * uStack_1c0._4_4_;
            local_bf8._0_4_ = (float)local_31e8;
            local_bf8._4_4_ = (float)((ulong)local_31e8 >> 0x20);
            uStack_bf0._0_4_ = (float)uStack_31e0;
            uStack_bf0._4_4_ = (float)((ulong)uStack_31e0 >> 0x20);
            local_1308 = CONCAT44(fStack_be4 + local_bf8._4_4_,local_be8 + (float)local_bf8);
            uStack_1300 = CONCAT44(fStack_bdc + uStack_bf0._4_4_,fStack_be0 + (float)uStack_bf0);
            local_1230 = local_12a0;
            local_1248 = local_1308;
            uStack_1240 = uStack_1300;
            *(undefined8 *)local_12a0 = local_1308;
            *(undefined8 *)(local_12a0 + 2) = uStack_1300;
            local_12a0 = local_12a0 + 4;
            local_bf8 = local_31e8;
            uStack_bf0 = uStack_31e0;
            local_1c8 = local_31d8;
            uStack_1c0 = uStack_31d0;
            local_1b8 = local_c08;
            uStack_1b0 = uStack_c00;
          }
          for (; local_12ec < local_2e3c; local_12ec = local_12ec + 1) {
            *local_12a0 = *local_12a0 * local_12bc + local_12c0;
            local_12a0 = local_12a0 + 1;
          }
        }
        else {
          local_16a0 = local_2e30;
          local_16a8 = local_2ee0;
          local_16b0 = local_2ee8;
          local_16b8 = local_2e48;
          local_16c0 = local_2e50;
          local_16c4 = local_2e34;
          local_16c8 = local_2e3c;
          if (local_2e34 == 4) {
            local_16cc = 0;
            local_15f0 = local_2ee0;
            local_16e8 = *(undefined8 *)local_2ee0;
            uStack_16e0 = *(undefined8 *)(local_2ee0 + 2);
            local_15f8 = local_2ee8;
            local_16f8 = *(undefined8 *)local_2ee8;
            uStack_16f0 = *(undefined8 *)(local_2ee8 + 2);
            for (; local_16cc + 4 <= local_2e3c; local_16cc = local_16cc + 4) {
              local_1600 = local_16a0;
              local_a78 = *(undefined8 *)local_16a0;
              uStack_a70 = *(undefined8 *)(local_16a0 + 2);
              local_1638 = *local_16b8;
              local_1718 = CONCAT44(local_1638,local_1638);
              uStack_1710 = CONCAT44(local_1638,local_1638);
              local_1658 = *local_16c0;
              local_1728 = CONCAT44(local_1658,local_1658);
              uStack_1720 = CONCAT44(local_1658,local_1658);
              local_258._0_4_ = (float)local_a78;
              local_258._4_4_ = (float)((ulong)local_a78 >> 0x20);
              uStack_250._0_4_ = (float)uStack_a70;
              uStack_250._4_4_ = (float)((ulong)uStack_a70 >> 0x20);
              local_268._0_4_ = (float)local_16e8;
              local_268._4_4_ = (float)((ulong)local_16e8 >> 0x20);
              uStack_260._0_4_ = (float)uStack_16e0;
              uStack_260._4_4_ = (float)((ulong)uStack_16e0 >> 0x20);
              local_a58 = (float)local_258 * (float)local_268;
              fStack_a54 = local_258._4_4_ * local_268._4_4_;
              fStack_a50 = (float)uStack_250 * (float)uStack_260;
              fStack_a4c = uStack_250._4_4_ * uStack_260._4_4_;
              local_a68._0_4_ = (float)local_16f8;
              local_a68._4_4_ = (float)((ulong)local_16f8 >> 0x20);
              uStack_a60._0_4_ = (float)uStack_16f0;
              uStack_a60._4_4_ = (float)((ulong)uStack_16f0 >> 0x20);
              local_1708 = CONCAT44(fStack_a54 + local_a68._4_4_,local_a58 + (float)local_a68);
              uStack_1700 = CONCAT44(fStack_a4c + uStack_a60._4_4_,fStack_a50 + (float)uStack_a60);
              local_ac8 = local_1708;
              uStack_ac0 = uStack_1700;
              local_238 = local_1708;
              uStack_230 = uStack_1700;
              local_aa8 = (local_a58 + (float)local_a68) * local_1638;
              fStack_aa4 = (fStack_a54 + local_a68._4_4_) * local_1638;
              fStack_aa0 = (fStack_a50 + (float)uStack_a60) * local_1638;
              fStack_a9c = (fStack_a4c + uStack_a60._4_4_) * local_1638;
              local_1708 = CONCAT44(fStack_aa4 + local_1658,local_aa8 + local_1658);
              uStack_1700 = CONCAT44(fStack_a9c + local_1658,fStack_aa0 + local_1658);
              local_15b0 = local_16a0;
              local_15c8 = local_1708;
              uStack_15c0 = uStack_1700;
              *(undefined8 *)local_16a0 = local_1708;
              *(undefined8 *)(local_16a0 + 2) = uStack_1700;
              local_16a0 = local_16a0 + 4;
              local_16b8 = local_16b8 + 1;
              local_16c0 = local_16c0 + 1;
              fStack_1654 = local_1658;
              fStack_1650 = local_1658;
              fStack_164c = local_1658;
              local_1648 = local_1658;
              fStack_1634 = local_1638;
              fStack_1630 = local_1638;
              fStack_162c = local_1638;
              local_161c = local_1638;
              local_ae8 = local_1728;
              uStack_ae0 = uStack_1720;
              local_ad8 = local_1718;
              uStack_ad0 = uStack_1710;
              local_ab8 = local_1728;
              uStack_ab0 = uStack_1720;
              local_a98 = local_16f8;
              uStack_a90 = uStack_16f0;
              local_a88 = local_16e8;
              uStack_a80 = uStack_16e0;
              local_a68 = local_16f8;
              uStack_a60 = uStack_16f0;
              local_268 = local_16e8;
              uStack_260 = uStack_16e0;
              local_258 = local_a78;
              uStack_250 = uStack_a70;
              local_248 = local_1718;
              uStack_240 = uStack_1710;
            }
          }
          if (local_2e34 == 1) {
            local_172c = 0;
            local_1730 = *local_2ee0;
            local_1734 = *local_2ee8;
            local_1748 = CONCAT44(local_1730,local_1730);
            uStack_1740 = CONCAT44(local_1730,local_1730);
            local_1758 = CONCAT44(local_1734,local_1734);
            uStack_1750 = CONCAT44(local_1734,local_1734);
            for (; local_172c + 4 <= local_2e3c; local_172c = local_172c + 4) {
              local_1608 = local_16a0;
              local_9d8 = *(undefined8 *)local_16a0;
              uStack_9d0 = *(undefined8 *)(local_16a0 + 2);
              local_1610 = local_16b8;
              local_1778 = *(undefined8 *)local_16b8;
              uStack_1770 = *(undefined8 *)(local_16b8 + 2);
              local_1618 = local_16c0;
              local_1788 = *(undefined8 *)local_16c0;
              uStack_1780 = *(undefined8 *)(local_16c0 + 2);
              local_298._0_4_ = (float)local_9d8;
              local_298._4_4_ = (float)((ulong)local_9d8 >> 0x20);
              uStack_290._0_4_ = (float)uStack_9d0;
              uStack_290._4_4_ = (float)((ulong)uStack_9d0 >> 0x20);
              local_9b8 = (float)local_298 * local_1730;
              fStack_9b4 = local_298._4_4_ * local_1730;
              fStack_9b0 = (float)uStack_290 * local_1730;
              fStack_9ac = uStack_290._4_4_ * local_1730;
              local_1768 = CONCAT44(fStack_9b4 + local_1734,local_9b8 + local_1734);
              uStack_1760 = CONCAT44(fStack_9ac + local_1734,fStack_9b0 + local_1734);
              local_a28 = local_1768;
              uStack_a20 = uStack_1760;
              local_278 = local_1768;
              uStack_270 = uStack_1760;
              local_288._0_4_ = (float)local_1778;
              local_288._4_4_ = (float)((ulong)local_1778 >> 0x20);
              uStack_280._0_4_ = (float)uStack_1770;
              uStack_280._4_4_ = (float)((ulong)uStack_1770 >> 0x20);
              local_a08 = (local_9b8 + local_1734) * (float)local_288;
              fStack_a04 = (fStack_9b4 + local_1734) * local_288._4_4_;
              fStack_a00 = (fStack_9b0 + local_1734) * (float)uStack_280;
              fStack_9fc = (fStack_9ac + local_1734) * uStack_280._4_4_;
              local_a18._0_4_ = (float)local_1788;
              local_a18._4_4_ = (float)((ulong)local_1788 >> 0x20);
              uStack_a10._0_4_ = (float)uStack_1780;
              uStack_a10._4_4_ = (float)((ulong)uStack_1780 >> 0x20);
              local_1768 = CONCAT44(fStack_a04 + local_a18._4_4_,local_a08 + (float)local_a18);
              uStack_1760 = CONCAT44(fStack_9fc + uStack_a10._4_4_,fStack_a00 + (float)uStack_a10);
              local_15d0 = local_16a0;
              local_15e8 = local_1768;
              uStack_15e0 = uStack_1760;
              *(undefined8 *)local_16a0 = local_1768;
              *(undefined8 *)(local_16a0 + 2) = uStack_1760;
              local_16a0 = local_16a0 + 4;
              local_16b8 = local_16b8 + 4;
              local_16c0 = local_16c0 + 4;
              local_a48 = local_1788;
              uStack_a40 = uStack_1780;
              local_a38 = local_1778;
              uStack_a30 = uStack_1770;
              local_a18 = local_1788;
              uStack_a10 = uStack_1780;
              local_9f8 = local_1758;
              uStack_9f0 = uStack_1750;
              local_9e8 = local_1748;
              uStack_9e0 = uStack_1740;
              local_9c8 = local_1758;
              uStack_9c0 = uStack_1750;
              local_2a8 = local_1748;
              uStack_2a0 = uStack_1740;
              local_298 = local_9d8;
              uStack_290 = uStack_9d0;
              local_288 = local_1778;
              uStack_280 = uStack_1770;
            }
            for (; local_1698 = local_1734, fStack_1694 = local_1734, fStack_1690 = local_1734,
                fStack_168c = local_1734, local_1688 = local_1734, local_1678 = local_1730,
                fStack_1674 = local_1730, fStack_1670 = local_1730, fStack_166c = local_1730,
                local_165c = local_1730, local_172c < local_2e3c; local_172c = local_172c + 1) {
              *local_16a0 = (*local_16a0 * local_1730 + local_1734) * *local_16b8 + *local_16c0;
              local_16a0 = local_16a0 + 1;
              local_16b8 = local_16b8 + 1;
              local_16c0 = local_16c0 + 1;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}